

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  ulong uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  byte bVar85;
  uint uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar89;
  ulong uVar90;
  uint uVar91;
  long lVar92;
  long lVar93;
  uint uVar94;
  byte bVar95;
  bool bVar96;
  float fVar97;
  float fVar122;
  float fVar123;
  __m128 a;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar98 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar113 [32];
  float fVar124;
  undefined1 auVar114 [32];
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar131;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar99 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar132;
  float fVar154;
  float fVar155;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar156;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar157;
  undefined1 auVar143 [32];
  float fVar158;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar159;
  float fVar180;
  float fVar181;
  vint4 bi_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar167 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar223;
  float fVar241;
  float fVar242;
  vint4 ai_1;
  undefined1 auVar224 [16];
  float fVar243;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [28];
  float fVar246;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar240 [64];
  float fVar247;
  float fVar248;
  float fVar255;
  float fVar257;
  vint4 bi_1;
  undefined1 auVar249 [16];
  float fVar261;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar266;
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  undefined1 auVar253 [32];
  float fVar265;
  float fVar268;
  float fVar271;
  undefined1 auVar254 [64];
  float fVar274;
  float fVar280;
  float fVar281;
  vint4 ai_2;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar282;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar279 [64];
  float fVar286;
  float fVar300;
  float fVar306;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar339;
  float fVar340;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float fVar341;
  float fVar349;
  float fVar350;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar351;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar348 [64];
  float fVar355;
  float fVar356;
  float fVar360;
  float fVar362;
  undefined1 auVar357 [16];
  float fVar361;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar358 [32];
  float fVar373;
  float fVar379;
  float fVar380;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar376 [32];
  float fVar381;
  undefined1 auVar377 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar388;
  float fVar391;
  float fVar392;
  undefined1 auVar389 [16];
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar390 [32];
  undefined1 auVar397 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b24;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  int local_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 auStack_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined4 local_918;
  float local_914;
  undefined4 local_910;
  undefined4 local_90c;
  uint local_908;
  uint local_904;
  uint local_900;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [16];
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar359 [64];
  undefined1 auVar378 [64];
  
  PVar11 = prim[1];
  uVar87 = (ulong)(byte)PVar11;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 6)));
  lVar92 = uVar87 * 0x25;
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x11 + 6)));
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 6)));
  fVar247 = *(float *)(prim + lVar92 + 0x12);
  auVar102 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar92 + 6));
  auVar374._0_4_ = fVar247 * (ray->dir).field_0.m128[0];
  auVar374._4_4_ = fVar247 * (ray->dir).field_0.m128[1];
  auVar374._8_4_ = fVar247 * (ray->dir).field_0.m128[2];
  auVar374._12_4_ = fVar247 * (ray->dir).field_0.m128[3];
  auVar207._0_4_ = auVar102._0_4_ * fVar247;
  auVar207._4_4_ = auVar102._4_4_ * fVar247;
  auVar207._8_4_ = auVar102._8_4_ * fVar247;
  auVar207._12_4_ = auVar102._12_4_ * fVar247;
  auVar102 = vcvtdq2ps_avx(auVar193);
  auVar17 = vcvtdq2ps_avx(auVar20);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 6)));
  auVar20 = vshufps_avx(auVar374,auVar374,0x55);
  auVar101 = vshufps_avx(auVar374,auVar374,0xaa);
  fVar247 = auVar101._0_4_;
  fVar255 = auVar101._4_4_;
  fVar257 = auVar101._8_4_;
  fVar261 = auVar101._12_4_;
  fVar183 = auVar20._0_4_;
  fVar184 = auVar20._4_4_;
  fVar185 = auVar20._8_4_;
  fVar158 = auVar20._12_4_;
  auVar101 = vcvtdq2ps_avx(auVar19);
  auVar108 = vcvtdq2ps_avx(auVar21);
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar133 = vcvtdq2ps_avx(auVar193);
  auVar19 = vshufps_avx(auVar374,auVar374,0);
  fVar223 = auVar19._0_4_;
  fVar241 = auVar19._4_4_;
  fVar242 = auVar19._8_4_;
  fVar243 = auVar19._12_4_;
  auVar332._0_4_ = fVar223 * auVar101._0_4_ + fVar183 * auVar102._0_4_ + fVar247 * auVar17._0_4_;
  auVar332._4_4_ = fVar241 * auVar101._4_4_ + fVar184 * auVar102._4_4_ + fVar255 * auVar17._4_4_;
  auVar332._8_4_ = fVar242 * auVar101._8_4_ + fVar185 * auVar102._8_4_ + fVar257 * auVar17._8_4_;
  auVar332._12_4_ = fVar243 * auVar101._12_4_ + fVar158 * auVar102._12_4_ + fVar261 * auVar17._12_4_
  ;
  auVar292._0_4_ = fVar223 * auVar108._0_4_ + fVar183 * auVar22._0_4_ + auVar109._0_4_ * fVar247;
  auVar292._4_4_ = fVar241 * auVar108._4_4_ + fVar184 * auVar22._4_4_ + auVar109._4_4_ * fVar255;
  auVar292._8_4_ = fVar242 * auVar108._8_4_ + fVar185 * auVar22._8_4_ + auVar109._8_4_ * fVar257;
  auVar292._12_4_ = fVar243 * auVar108._12_4_ + fVar158 * auVar22._12_4_ + auVar109._12_4_ * fVar261
  ;
  auVar160._0_4_ = fVar223 * auVar142._0_4_ + fVar183 * auVar139._0_4_ + fVar247 * auVar133._0_4_;
  auVar160._4_4_ = fVar241 * auVar142._4_4_ + fVar184 * auVar139._4_4_ + fVar255 * auVar133._4_4_;
  auVar160._8_4_ = fVar242 * auVar142._8_4_ + fVar185 * auVar139._8_4_ + fVar257 * auVar133._8_4_;
  auVar160._12_4_ =
       fVar243 * auVar142._12_4_ + fVar158 * auVar139._12_4_ + fVar261 * auVar133._12_4_;
  auVar19 = vshufps_avx(auVar207,auVar207,0x55);
  auVar193 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar183 = auVar193._0_4_;
  fVar184 = auVar193._4_4_;
  fVar185 = auVar193._8_4_;
  fVar158 = auVar193._12_4_;
  fVar223 = auVar19._0_4_;
  fVar241 = auVar19._4_4_;
  fVar242 = auVar19._8_4_;
  fVar243 = auVar19._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar134 = vpmovsxwd_avx(auVar19);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar135 = vpmovsxwd_avx(auVar193);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar162 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar19 = vshufps_avx(auVar207,auVar207,0);
  fVar247 = auVar19._0_4_;
  fVar255 = auVar19._4_4_;
  fVar257 = auVar19._8_4_;
  fVar261 = auVar19._12_4_;
  auVar342._0_4_ = auVar101._0_4_ * fVar247 + fVar223 * auVar102._0_4_ + fVar183 * auVar17._0_4_;
  auVar342._4_4_ = auVar101._4_4_ * fVar255 + fVar241 * auVar102._4_4_ + fVar184 * auVar17._4_4_;
  auVar342._8_4_ = auVar101._8_4_ * fVar257 + fVar242 * auVar102._8_4_ + fVar185 * auVar17._8_4_;
  auVar342._12_4_ = auVar101._12_4_ * fVar261 + fVar243 * auVar102._12_4_ + fVar158 * auVar17._12_4_
  ;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 6);
  auVar102 = vpmovsxwd_avx(auVar102);
  auVar275._0_4_ = auVar109._0_4_ * fVar183 + fVar223 * auVar22._0_4_ + fVar247 * auVar108._0_4_;
  auVar275._4_4_ = auVar109._4_4_ * fVar184 + fVar241 * auVar22._4_4_ + fVar255 * auVar108._4_4_;
  auVar275._8_4_ = auVar109._8_4_ * fVar185 + fVar242 * auVar22._8_4_ + fVar257 * auVar108._8_4_;
  auVar275._12_4_ = auVar109._12_4_ * fVar158 + fVar243 * auVar22._12_4_ + fVar261 * auVar108._12_4_
  ;
  auVar208._0_4_ = fVar247 * auVar142._0_4_ + fVar223 * auVar139._0_4_ + fVar183 * auVar133._0_4_;
  auVar208._4_4_ = fVar255 * auVar142._4_4_ + fVar241 * auVar139._4_4_ + fVar184 * auVar133._4_4_;
  auVar208._8_4_ = fVar257 * auVar142._8_4_ + fVar242 * auVar139._8_4_ + fVar185 * auVar133._8_4_;
  auVar208._12_4_ =
       fVar261 * auVar142._12_4_ + fVar243 * auVar139._12_4_ + fVar158 * auVar133._12_4_;
  auVar389._8_4_ = 0x7fffffff;
  auVar389._0_8_ = 0x7fffffff7fffffff;
  auVar389._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx(auVar332,auVar389);
  auVar249._8_4_ = 0x219392ef;
  auVar249._0_8_ = 0x219392ef219392ef;
  auVar249._12_4_ = 0x219392ef;
  auVar19 = vcmpps_avx(auVar19,auVar249,1);
  auVar193 = vblendvps_avx(auVar332,auVar249,auVar19);
  auVar19 = vandps_avx(auVar292,auVar389);
  auVar19 = vcmpps_avx(auVar19,auVar249,1);
  auVar20 = vblendvps_avx(auVar292,auVar249,auVar19);
  auVar19 = vandps_avx(auVar389,auVar160);
  auVar19 = vcmpps_avx(auVar19,auVar249,1);
  auVar19 = vblendvps_avx(auVar160,auVar249,auVar19);
  auVar17 = vrcpps_avx(auVar193);
  fVar223 = auVar17._0_4_;
  auVar224._0_4_ = fVar223 * auVar193._0_4_;
  fVar241 = auVar17._4_4_;
  auVar224._4_4_ = fVar241 * auVar193._4_4_;
  fVar242 = auVar17._8_4_;
  auVar224._8_4_ = fVar242 * auVar193._8_4_;
  fVar243 = auVar17._12_4_;
  auVar224._12_4_ = fVar243 * auVar193._12_4_;
  auVar333._8_4_ = 0x3f800000;
  auVar333._0_8_ = 0x3f8000003f800000;
  auVar333._12_4_ = 0x3f800000;
  auVar193 = vsubps_avx(auVar333,auVar224);
  fVar223 = fVar223 + fVar223 * auVar193._0_4_;
  fVar241 = fVar241 + fVar241 * auVar193._4_4_;
  fVar242 = fVar242 + fVar242 * auVar193._8_4_;
  fVar243 = fVar243 + fVar243 * auVar193._12_4_;
  auVar193 = vrcpps_avx(auVar20);
  fVar247 = auVar193._0_4_;
  auVar293._0_4_ = auVar20._0_4_ * fVar247;
  fVar255 = auVar193._4_4_;
  auVar293._4_4_ = auVar20._4_4_ * fVar255;
  fVar257 = auVar193._8_4_;
  auVar293._8_4_ = auVar20._8_4_ * fVar257;
  fVar261 = auVar193._12_4_;
  auVar293._12_4_ = auVar20._12_4_ * fVar261;
  auVar193 = vsubps_avx(auVar333,auVar293);
  fVar247 = auVar193._0_4_ * fVar247 + fVar247;
  fVar255 = auVar193._4_4_ * fVar255 + fVar255;
  fVar257 = auVar193._8_4_ * fVar257 + fVar257;
  fVar261 = auVar193._12_4_ * fVar261 + fVar261;
  auVar193 = vrcpps_avx(auVar19);
  fVar286 = auVar193._0_4_;
  auVar161._0_4_ = fVar286 * auVar19._0_4_;
  fVar300 = auVar193._4_4_;
  auVar161._4_4_ = fVar300 * auVar19._4_4_;
  fVar306 = auVar193._8_4_;
  auVar161._8_4_ = fVar306 * auVar19._8_4_;
  fVar312 = auVar193._12_4_;
  auVar161._12_4_ = fVar312 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar333,auVar161);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar87 * 0x16 + 6);
  auVar20 = vpmovsxwd_avx(auVar17);
  fVar286 = fVar286 + fVar286 * auVar19._0_4_;
  fVar300 = fVar300 + fVar300 * auVar19._4_4_;
  fVar306 = fVar306 + fVar306 * auVar19._8_4_;
  fVar312 = fVar312 + fVar312 * auVar19._12_4_;
  auVar17 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                         *(float *)(prim + lVar92 + 0x16)) *
                                        *(float *)(prim + lVar92 + 0x1a))),0);
  auVar19 = vcvtdq2ps_avx(auVar134);
  auVar193 = vcvtdq2ps_avx(auVar135);
  auVar193 = vsubps_avx(auVar193,auVar19);
  fVar183 = auVar17._0_4_;
  fVar184 = auVar17._4_4_;
  fVar185 = auVar17._8_4_;
  fVar158 = auVar17._12_4_;
  auVar133._0_4_ = fVar183 * auVar193._0_4_ + auVar19._0_4_;
  auVar133._4_4_ = fVar184 * auVar193._4_4_ + auVar19._4_4_;
  auVar133._8_4_ = fVar185 * auVar193._8_4_ + auVar19._8_4_;
  auVar133._12_4_ = fVar158 * auVar193._12_4_ + auVar19._12_4_;
  auVar19 = vcvtdq2ps_avx(auVar162);
  auVar193 = vcvtdq2ps_avx(auVar21);
  auVar193 = vsubps_avx(auVar193,auVar19);
  auVar186._0_4_ = auVar193._0_4_ * fVar183 + auVar19._0_4_;
  auVar186._4_4_ = auVar193._4_4_ * fVar184 + auVar19._4_4_;
  auVar186._8_4_ = auVar193._8_4_ * fVar185 + auVar19._8_4_;
  auVar186._12_4_ = auVar193._12_4_ * fVar158 + auVar19._12_4_;
  auVar19 = vcvtdq2ps_avx(auVar102);
  auVar193 = vcvtdq2ps_avx(auVar20);
  auVar193 = vsubps_avx(auVar193,auVar19);
  auVar334._0_4_ = auVar193._0_4_ * fVar183 + auVar19._0_4_;
  auVar334._4_4_ = auVar193._4_4_ * fVar184 + auVar19._4_4_;
  auVar334._8_4_ = auVar193._8_4_ * fVar185 + auVar19._8_4_;
  auVar334._12_4_ = auVar193._12_4_ * fVar158 + auVar19._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar87 * 0x14 + 6);
  auVar19 = vpmovsxwd_avx(auVar22);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 6);
  auVar193 = vpmovsxwd_avx(auVar109);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar19);
  auVar357._0_4_ = auVar193._0_4_ * fVar183 + auVar19._0_4_;
  auVar357._4_4_ = auVar193._4_4_ * fVar184 + auVar19._4_4_;
  auVar357._8_4_ = auVar193._8_4_ * fVar185 + auVar19._8_4_;
  auVar357._12_4_ = auVar193._12_4_ * fVar158 + auVar19._12_4_;
  auVar359 = ZEXT1664(auVar357);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 6);
  auVar19 = vpmovsxwd_avx(auVar101);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar87 * 0x21 + 6);
  auVar193 = vpmovsxwd_avx(auVar108);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar20 = vsubps_avx(auVar193,auVar19);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar87 * 0x1f + 6);
  auVar193 = vpmovsxwd_avx(auVar142);
  auVar375._0_4_ = auVar20._0_4_ * fVar183 + auVar19._0_4_;
  auVar375._4_4_ = auVar20._4_4_ * fVar184 + auVar19._4_4_;
  auVar375._8_4_ = auVar20._8_4_ * fVar185 + auVar19._8_4_;
  auVar375._12_4_ = auVar20._12_4_ * fVar158 + auVar19._12_4_;
  auVar378 = ZEXT1664(auVar375);
  auVar19 = vcvtdq2ps_avx(auVar193);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 6);
  auVar193 = vpmovsxwd_avx(auVar139);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar193 = vsubps_avx(auVar193,auVar19);
  auVar162._0_4_ = auVar19._0_4_ + auVar193._0_4_ * fVar183;
  auVar162._4_4_ = auVar19._4_4_ + auVar193._4_4_ * fVar184;
  auVar162._8_4_ = auVar19._8_4_ + auVar193._8_4_ * fVar185;
  auVar162._12_4_ = auVar19._12_4_ + auVar193._12_4_ * fVar158;
  auVar19 = vsubps_avx(auVar133,auVar342);
  auVar134._0_4_ = fVar223 * auVar19._0_4_;
  auVar134._4_4_ = fVar241 * auVar19._4_4_;
  auVar134._8_4_ = fVar242 * auVar19._8_4_;
  auVar134._12_4_ = fVar243 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar186,auVar342);
  auVar187._0_4_ = fVar223 * auVar19._0_4_;
  auVar187._4_4_ = fVar241 * auVar19._4_4_;
  auVar187._8_4_ = fVar242 * auVar19._8_4_;
  auVar187._12_4_ = fVar243 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar334,auVar275);
  auVar225._0_4_ = fVar247 * auVar19._0_4_;
  auVar225._4_4_ = fVar255 * auVar19._4_4_;
  auVar225._8_4_ = fVar257 * auVar19._8_4_;
  auVar225._12_4_ = fVar261 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar357,auVar275);
  auVar250._0_4_ = fVar247 * auVar19._0_4_;
  auVar250._4_4_ = fVar255 * auVar19._4_4_;
  auVar250._8_4_ = fVar257 * auVar19._8_4_;
  auVar250._12_4_ = fVar261 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar375,auVar208);
  auVar276._0_4_ = fVar286 * auVar19._0_4_;
  auVar276._4_4_ = fVar300 * auVar19._4_4_;
  auVar276._8_4_ = fVar306 * auVar19._8_4_;
  auVar276._12_4_ = fVar312 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar162,auVar208);
  auVar163._0_4_ = fVar286 * auVar19._0_4_;
  auVar163._4_4_ = fVar300 * auVar19._4_4_;
  auVar163._8_4_ = fVar306 * auVar19._8_4_;
  auVar163._12_4_ = fVar312 * auVar19._12_4_;
  auVar19 = vpminsd_avx(auVar134,auVar187);
  auVar193 = vpminsd_avx(auVar225,auVar250);
  auVar19 = vmaxps_avx(auVar19,auVar193);
  auVar193 = vpminsd_avx(auVar276,auVar163);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar335._4_4_ = uVar7;
  auVar335._0_4_ = uVar7;
  auVar335._8_4_ = uVar7;
  auVar335._12_4_ = uVar7;
  auVar193 = vmaxps_avx(auVar193,auVar335);
  auVar19 = vmaxps_avx(auVar19,auVar193);
  local_600._0_4_ = auVar19._0_4_ * 0.99999964;
  local_600._4_4_ = auVar19._4_4_ * 0.99999964;
  local_600._8_4_ = auVar19._8_4_ * 0.99999964;
  local_600._12_4_ = auVar19._12_4_ * 0.99999964;
  auVar19 = vpmaxsd_avx(auVar134,auVar187);
  auVar193 = vpmaxsd_avx(auVar225,auVar250);
  auVar19 = vminps_avx(auVar19,auVar193);
  auVar193 = vpmaxsd_avx(auVar276,auVar163);
  fVar247 = ray->tfar;
  auVar188._4_4_ = fVar247;
  auVar188._0_4_ = fVar247;
  auVar188._8_4_ = fVar247;
  auVar188._12_4_ = fVar247;
  auVar193 = vminps_avx(auVar193,auVar188);
  auVar19 = vminps_avx(auVar19,auVar193);
  auVar193 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar193 = vpcmpgtd_avx(auVar193,_DAT_01f4ad30);
  auVar135._0_4_ = auVar19._0_4_ * 1.0000004;
  auVar135._4_4_ = auVar19._4_4_ * 1.0000004;
  auVar135._8_4_ = auVar19._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar19._12_4_ * 1.0000004;
  auVar19 = vcmpps_avx(local_600,auVar135,2);
  auVar19 = vandps_avx(auVar19,auVar193);
  uVar91 = vmovmskps_avx(auVar19);
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
LAB_008c4832:
  local_828 = (ulong)uVar91;
  auVar201._8_4_ = 0x7fffffff;
  auVar201._0_8_ = 0x7fffffff7fffffff;
  auVar201._12_4_ = 0x7fffffff;
  auVar201._16_4_ = 0x7fffffff;
  auVar201._20_4_ = 0x7fffffff;
  auVar201._24_4_ = 0x7fffffff;
  auVar201._28_4_ = 0x7fffffff;
  if (local_828 == 0) {
LAB_008c7109:
    return local_828 != 0;
  }
  lVar92 = 0;
  if (local_828 != 0) {
    for (; (uVar91 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  uVar91 = *(uint *)(prim + 2);
  local_8e8 = (ulong)*(uint *)(prim + lVar92 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar91].ptr;
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_8e8 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar247 = (pGVar12->time_range).lower;
  auVar348 = ZEXT3264(auVar201);
  fVar247 = pGVar12->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar247) / ((pGVar12->time_range).upper - fVar247));
  auVar19 = vroundss_avx(ZEXT416((uint)fVar247),ZEXT416((uint)fVar247),9);
  auVar19 = vminss_avx(auVar19,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar19 = vmaxss_avx(ZEXT816(0) << 0x20,auVar19);
  fVar247 = fVar247 - auVar19._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar93 = (long)(int)auVar19._0_4_ * 0x38;
  lVar92 = *(long *)(_Var13 + 0x10 + lVar93);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar93);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar93);
  auVar19 = vshufps_avx(ZEXT416((uint)fVar247),ZEXT416((uint)fVar247),0);
  pfVar1 = (float *)(lVar14 + uVar87 * lVar15);
  fVar183 = auVar19._0_4_;
  fVar184 = auVar19._4_4_;
  fVar185 = auVar19._8_4_;
  fVar158 = auVar19._12_4_;
  pfVar2 = (float *)(lVar14 + (uVar87 + 1) * lVar15);
  pfVar3 = (float *)(lVar14 + (uVar87 + 2) * lVar15);
  pfVar4 = (float *)(lVar14 + lVar15 * (uVar87 + 3));
  lVar14 = *(long *)(_Var13 + lVar93);
  auVar19 = vshufps_avx(ZEXT416((uint)(1.0 - fVar247)),ZEXT416((uint)(1.0 - fVar247)),0);
  pfVar5 = (float *)(lVar14 + lVar92 * uVar87);
  fVar247 = auVar19._0_4_;
  fVar255 = auVar19._4_4_;
  fVar257 = auVar19._8_4_;
  fVar261 = auVar19._12_4_;
  pfVar6 = (float *)(lVar14 + lVar92 * (uVar87 + 1));
  auVar164._0_4_ = fVar183 * *pfVar1 + fVar247 * *pfVar5;
  auVar164._4_4_ = fVar184 * pfVar1[1] + fVar255 * pfVar5[1];
  auVar164._8_4_ = fVar185 * pfVar1[2] + fVar257 * pfVar5[2];
  auVar164._12_4_ = fVar158 * pfVar1[3] + fVar261 * pfVar5[3];
  pfVar1 = (float *)(lVar14 + lVar92 * (uVar87 + 2));
  auVar189._0_4_ = fVar247 * *pfVar6 + fVar183 * *pfVar2;
  auVar189._4_4_ = fVar255 * pfVar6[1] + fVar184 * pfVar2[1];
  auVar189._8_4_ = fVar257 * pfVar6[2] + fVar185 * pfVar2[2];
  auVar189._12_4_ = fVar261 * pfVar6[3] + fVar158 * pfVar2[3];
  auVar209._0_4_ = fVar247 * *pfVar1 + fVar183 * *pfVar3;
  auVar209._4_4_ = fVar255 * pfVar1[1] + fVar184 * pfVar3[1];
  auVar209._8_4_ = fVar257 * pfVar1[2] + fVar185 * pfVar3[2];
  auVar209._12_4_ = fVar261 * pfVar1[3] + fVar158 * pfVar3[3];
  pfVar1 = (float *)(lVar14 + lVar92 * (uVar87 + 3));
  auVar226._0_4_ = fVar247 * *pfVar1 + fVar183 * *pfVar4;
  auVar226._4_4_ = fVar255 * pfVar1[1] + fVar184 * pfVar4[1];
  auVar226._8_4_ = fVar257 * pfVar1[2] + fVar185 * pfVar4[2];
  auVar226._12_4_ = fVar261 * pfVar1[3] + fVar158 * pfVar4[3];
  auVar98._0_4_ = (auVar164._0_4_ + auVar189._0_4_ + auVar209._0_4_ + auVar226._0_4_) * 0.25;
  auVar98._4_4_ = (auVar164._4_4_ + auVar189._4_4_ + auVar209._4_4_ + auVar226._4_4_) * 0.25;
  auVar98._8_4_ = (auVar164._8_4_ + auVar189._8_4_ + auVar209._8_4_ + auVar226._8_4_) * 0.25;
  auVar98._12_4_ = (auVar164._12_4_ + auVar189._12_4_ + auVar209._12_4_ + auVar226._12_4_) * 0.25;
  aVar8 = (ray->org).field_0.field_1;
  aVar9 = (ray->dir).field_0.field_1;
  auVar19 = vsubps_avx(auVar98,(undefined1  [16])aVar8);
  auVar19 = vdpps_avx(auVar19,(undefined1  [16])aVar9,0x7f);
  auVar193 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
  auVar20 = vrcpss_avx(auVar193,auVar193);
  auVar338 = ZEXT464(0x40000000);
  fVar247 = auVar19._0_4_ * auVar20._0_4_ * (2.0 - auVar20._0_4_ * auVar193._0_4_);
  local_840 = ZEXT416((uint)fVar247);
  auVar193 = vshufps_avx(local_840,ZEXT416((uint)fVar247),0);
  fVar247 = aVar9.x;
  fVar255 = aVar9.y;
  fVar257 = aVar9.z;
  aVar156 = aVar9.field_3;
  auVar251._0_4_ = aVar8.x + fVar247 * auVar193._0_4_;
  auVar251._4_4_ = aVar8.y + fVar255 * auVar193._4_4_;
  auVar251._8_4_ = aVar8.z + fVar257 * auVar193._8_4_;
  auVar251._12_4_ = aVar8.field_3.w + aVar156.w * auVar193._12_4_;
  auVar19 = vblendps_avx(auVar251,_DAT_01f45a50,8);
  auVar17 = vsubps_avx(auVar164,auVar19);
  auVar279 = ZEXT1664(auVar17);
  auVar22 = vsubps_avx(auVar209,auVar19);
  _local_9a0 = vsubps_avx(auVar189,auVar19);
  _local_9b0 = vsubps_avx(auVar226,auVar19);
  auVar240 = ZEXT1664(_local_9b0);
  auVar19 = vshufps_avx(auVar17,auVar17,0);
  auVar20 = vshufps_avx(auVar17,auVar17,0x55);
  register0x00001290 = auVar20;
  _local_1e0 = auVar20;
  auVar20 = vshufps_avx(auVar17,auVar17,0xaa);
  register0x00001290 = auVar20;
  _local_200 = auVar20;
  auVar20 = vshufps_avx(auVar17,auVar17,0xff);
  register0x00001290 = auVar20;
  _local_220 = auVar20;
  auVar20 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001290 = auVar20;
  _local_240 = auVar20;
  auVar20 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001290 = auVar20;
  _local_260 = auVar20;
  auVar20 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001290 = auVar20;
  _local_280 = auVar20;
  auVar136._0_4_ = fVar247 * fVar247;
  auVar136._4_4_ = fVar255 * fVar255;
  auVar136._8_4_ = fVar257 * fVar257;
  auVar136._12_4_ = aVar156.w * aVar156.w;
  auVar20 = vshufps_avx(auVar136,auVar136,0xaa);
  auVar21 = vshufps_avx(auVar136,auVar136,0x55);
  auVar102 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x000012d0 = auVar102;
  _local_3e0 = auVar102;
  auVar102 = vshufps_avx(auVar136,auVar136,0);
  local_2a0._0_4_ = auVar102._0_4_ + auVar21._0_4_ + auVar20._0_4_;
  local_2a0._4_4_ = auVar102._4_4_ + auVar21._4_4_ + auVar20._4_4_;
  local_2a0._8_4_ = auVar102._8_4_ + auVar21._8_4_ + auVar20._8_4_;
  local_2a0._12_4_ = auVar102._12_4_ + auVar21._12_4_ + auVar20._12_4_;
  local_2a0._16_4_ = auVar102._0_4_ + auVar21._0_4_ + auVar20._0_4_;
  local_2a0._20_4_ = auVar102._4_4_ + auVar21._4_4_ + auVar20._4_4_;
  local_2a0._24_4_ = auVar102._8_4_ + auVar21._8_4_ + auVar20._8_4_;
  local_2a0._28_4_ = auVar102._12_4_ + auVar21._12_4_ + auVar20._12_4_;
  auVar254 = ZEXT3264(local_2a0);
  auVar20 = vshufps_avx(auVar22,auVar22,0);
  register0x00001250 = auVar20;
  _local_400 = auVar20;
  auVar20 = vshufps_avx(auVar22,auVar22,0x55);
  register0x00001250 = auVar20;
  _local_420 = auVar20;
  auVar20 = vshufps_avx(auVar22,auVar22,0xaa);
  register0x00001250 = auVar20;
  _local_440 = auVar20;
  auVar20 = vshufps_avx(auVar22,auVar22,0xff);
  register0x00001250 = auVar20;
  _local_460 = auVar20;
  auVar20 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001250 = auVar20;
  _local_480 = auVar20;
  auVar20 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001250 = auVar20;
  _local_4a0 = auVar20;
  auVar20 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001250 = auVar20;
  _local_4c0 = auVar20;
  auVar20 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x00001250 = auVar20;
  _local_4e0 = auVar20;
  register0x00001210 = auVar193;
  _local_6e0 = auVar193;
  uVar87 = 0;
  bVar95 = 0;
  local_b24 = 1;
  local_620 = (ray->dir).field_0.m128[0];
  local_7a0 = (ray->dir).field_0.m128[1];
  local_7c0 = (ray->dir).field_0.m128[2];
  local_500 = vandps_avx(auVar201,local_2a0);
  local_5f0 = ZEXT816(0x3f80000000000000);
  fStack_7bc = local_7c0;
  fStack_7b8 = local_7c0;
  fStack_7b4 = local_7c0;
  fStack_7b0 = local_7c0;
  fStack_7ac = local_7c0;
  fStack_7a8 = local_7c0;
  fStack_7a4 = local_7c0;
  fStack_79c = local_7a0;
  fStack_798 = local_7a0;
  fStack_794 = local_7a0;
  fStack_790 = local_7a0;
  fStack_78c = local_7a0;
  fStack_788 = local_7a0;
  fStack_784 = local_7a0;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  do {
    auVar193 = vmovshdup_avx(local_5f0);
    auVar21 = vsubps_avx(auVar193,local_5f0);
    auVar193 = vshufps_avx(local_5f0,local_5f0,0);
    local_740._16_16_ = auVar193;
    local_740._0_16_ = auVar193;
    auVar20 = vshufps_avx(auVar21,auVar21,0);
    local_760._16_16_ = auVar20;
    local_760._0_16_ = auVar20;
    fVar132 = auVar20._0_4_;
    fVar154 = auVar20._4_4_;
    fVar155 = auVar20._8_4_;
    fVar157 = auVar20._12_4_;
    fVar159 = auVar193._0_4_;
    auVar202._0_4_ = fVar159 + fVar132 * 0.0;
    fVar180 = auVar193._4_4_;
    auVar202._4_4_ = fVar180 + fVar154 * 0.14285715;
    fVar181 = auVar193._8_4_;
    auVar202._8_4_ = fVar181 + fVar155 * 0.2857143;
    fVar182 = auVar193._12_4_;
    auVar202._12_4_ = fVar182 + fVar157 * 0.42857146;
    auVar202._16_4_ = fVar159 + fVar132 * 0.5714286;
    auVar202._20_4_ = fVar180 + fVar154 * 0.71428573;
    auVar202._24_4_ = fVar181 + fVar155 * 0.8571429;
    auVar202._28_4_ = fVar182 + fVar157;
    auVar143._8_4_ = 0x3f800000;
    auVar143._0_8_ = 0x3f8000003f800000;
    auVar143._12_4_ = 0x3f800000;
    auVar143._16_4_ = 0x3f800000;
    auVar143._20_4_ = 0x3f800000;
    auVar143._24_4_ = 0x3f800000;
    auVar143._28_4_ = 0x3f800000;
    auVar113 = vsubps_avx(auVar143,auVar202);
    fVar255 = auVar113._0_4_;
    fVar257 = auVar113._4_4_;
    fVar261 = auVar113._8_4_;
    fVar183 = auVar113._12_4_;
    fVar184 = auVar113._16_4_;
    fVar185 = auVar113._20_4_;
    fVar158 = auVar113._24_4_;
    fVar286 = fVar255 * fVar255 * fVar255;
    fVar306 = fVar257 * fVar257 * fVar257;
    fVar258 = fVar261 * fVar261 * fVar261;
    fVar262 = fVar183 * fVar183 * fVar183;
    fVar265 = fVar184 * fVar184 * fVar184;
    fVar268 = fVar185 * fVar185 * fVar185;
    fVar271 = fVar158 * fVar158 * fVar158;
    fVar274 = auVar202._0_4_ * auVar202._0_4_ * auVar202._0_4_;
    fVar280 = auVar202._4_4_ * auVar202._4_4_ * auVar202._4_4_;
    fVar281 = auVar202._8_4_ * auVar202._8_4_ * auVar202._8_4_;
    fVar282 = auVar202._12_4_ * auVar202._12_4_ * auVar202._12_4_;
    fVar283 = auVar202._16_4_ * auVar202._16_4_ * auVar202._16_4_;
    fVar284 = auVar202._20_4_ * auVar202._20_4_ * auVar202._20_4_;
    fVar285 = auVar202._24_4_ * auVar202._24_4_ * auVar202._24_4_;
    fVar247 = auVar240._28_4_;
    fVar223 = auVar202._0_4_ * fVar255;
    fVar241 = auVar202._4_4_ * fVar257;
    fVar242 = auVar202._8_4_ * fVar261;
    fVar243 = auVar202._12_4_ * fVar183;
    fVar244 = auVar202._16_4_ * fVar184;
    fVar245 = auVar202._20_4_ * fVar185;
    fVar246 = auVar202._24_4_ * fVar158;
    fVar300 = auVar348._28_4_ + auVar378._28_4_;
    fVar330 = auVar279._28_4_ + fVar247 + fVar300;
    fVar339 = fVar300 + auVar254._28_4_ + auVar359._28_4_ + auVar338._28_4_;
    fVar300 = fVar286 * 0.16666667;
    fVar312 = fVar306 * 0.16666667;
    fVar259 = fVar258 * 0.16666667;
    fVar263 = fVar262 * 0.16666667;
    fVar266 = fVar265 * 0.16666667;
    fVar269 = fVar268 * 0.16666667;
    fVar272 = fVar271 * 0.16666667;
    fVar287 = (fVar274 + fVar286 * 4.0 + fVar255 * fVar223 * 12.0 + auVar202._0_4_ * fVar223 * 6.0)
              * 0.16666667;
    fVar301 = (fVar280 + fVar306 * 4.0 + fVar257 * fVar241 * 12.0 + auVar202._4_4_ * fVar241 * 6.0)
              * 0.16666667;
    fVar307 = (fVar281 + fVar258 * 4.0 + fVar261 * fVar242 * 12.0 + auVar202._8_4_ * fVar242 * 6.0)
              * 0.16666667;
    fVar313 = (fVar282 + fVar262 * 4.0 + fVar183 * fVar243 * 12.0 + auVar202._12_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar318 = (fVar283 + fVar265 * 4.0 + fVar184 * fVar244 * 12.0 + auVar202._16_4_ * fVar244 * 6.0)
              * 0.16666667;
    fVar322 = (fVar284 + fVar268 * 4.0 + fVar185 * fVar245 * 12.0 + auVar202._20_4_ * fVar245 * 6.0)
              * 0.16666667;
    fVar326 = (fVar285 + fVar271 * 4.0 + fVar158 * fVar246 * 12.0 + auVar202._24_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar286 = (fVar274 * 4.0 + fVar286 + auVar202._0_4_ * fVar223 * 12.0 + fVar255 * fVar223 * 6.0)
              * 0.16666667;
    fVar306 = (fVar280 * 4.0 + fVar306 + auVar202._4_4_ * fVar241 * 12.0 + fVar257 * fVar241 * 6.0)
              * 0.16666667;
    fVar258 = (fVar281 * 4.0 + fVar258 + auVar202._8_4_ * fVar242 * 12.0 + fVar261 * fVar242 * 6.0)
              * 0.16666667;
    fVar262 = (fVar282 * 4.0 + fVar262 + auVar202._12_4_ * fVar243 * 12.0 + fVar183 * fVar243 * 6.0)
              * 0.16666667;
    fVar265 = (fVar283 * 4.0 + fVar265 + auVar202._16_4_ * fVar244 * 12.0 + fVar184 * fVar244 * 6.0)
              * 0.16666667;
    fVar268 = (fVar284 * 4.0 + fVar268 + auVar202._20_4_ * fVar245 * 12.0 + fVar185 * fVar245 * 6.0)
              * 0.16666667;
    fVar271 = (fVar285 * 4.0 + fVar271 + auVar202._24_4_ * fVar246 * 12.0 + fVar158 * fVar246 * 6.0)
              * 0.16666667;
    fVar274 = fVar274 * 0.16666667;
    fVar280 = fVar280 * 0.16666667;
    fVar281 = fVar281 * 0.16666667;
    fVar282 = fVar282 * 0.16666667;
    fVar283 = fVar283 * 0.16666667;
    fVar284 = fVar284 * 0.16666667;
    fVar285 = fVar285 * 0.16666667;
    fVar372 = auVar359._28_4_ + 12.0;
    fVar340 = fVar339 + 12.166667;
    fVar124 = auVar19._0_4_;
    fVar126 = auVar19._4_4_;
    fVar128 = auVar19._8_4_;
    local_880 = fVar124 * fVar300 +
                fVar287 * (float)local_240._0_4_ +
                fVar274 * (float)local_480._0_4_ + fVar286 * (float)local_400._0_4_;
    fStack_87c = fVar126 * fVar312 +
                 fVar301 * (float)local_240._4_4_ +
                 fVar280 * (float)local_480._4_4_ + fVar306 * (float)local_400._4_4_;
    fStack_878 = fVar128 * fVar259 +
                 fVar307 * fStack_238 + fVar281 * fStack_478 + fVar258 * fStack_3f8;
    fStack_874 = auVar19._12_4_ * fVar263 +
                 fVar313 * fStack_234 + fVar282 * fStack_474 + fVar262 * fStack_3f4;
    fStack_870 = fVar124 * fVar266 +
                 fVar318 * fStack_230 + fVar283 * fStack_470 + fVar265 * fStack_3f0;
    fStack_86c = fVar126 * fVar269 +
                 fVar322 * fStack_22c + fVar284 * fStack_46c + fVar268 * fStack_3ec;
    fStack_868 = fVar128 * fVar272 +
                 fVar326 * fStack_228 + fVar285 * fStack_468 + fVar271 * fStack_3e8;
    fStack_864 = fVar330 + fVar340;
    fVar288 = (float)local_1e0._0_4_ * fVar300 +
              (float)local_260._0_4_ * fVar287 +
              fVar274 * (float)local_4a0._0_4_ + fVar286 * (float)local_420._0_4_;
    fVar302 = (float)local_1e0._4_4_ * fVar312 +
              (float)local_260._4_4_ * fVar301 +
              fVar280 * (float)local_4a0._4_4_ + fVar306 * (float)local_420._4_4_;
    fVar308 = fStack_1d8 * fVar259 +
              fStack_258 * fVar307 + fVar281 * fStack_498 + fVar258 * fStack_418;
    fVar314 = fStack_1d4 * fVar263 +
              fStack_254 * fVar313 + fVar282 * fStack_494 + fVar262 * fStack_414;
    fVar319 = fStack_1d0 * fVar266 +
              fStack_250 * fVar318 + fVar283 * fStack_490 + fVar265 * fStack_410;
    fVar323 = fStack_1cc * fVar269 +
              fStack_24c * fVar322 + fVar284 * fStack_48c + fVar268 * fStack_40c;
    fVar327 = fStack_1c8 * fVar272 +
              fStack_248 * fVar326 + fVar285 * fStack_488 + fVar271 * fStack_408;
    fVar331 = fStack_864 + fVar372 + 12.166667;
    fVar289 = (float)local_200._0_4_ * fVar300 +
              (float)local_280._0_4_ * fVar287 +
              fVar274 * (float)local_4c0._0_4_ + fVar286 * (float)local_440._0_4_;
    fVar303 = (float)local_200._4_4_ * fVar312 +
              (float)local_280._4_4_ * fVar301 +
              fVar280 * (float)local_4c0._4_4_ + fVar306 * (float)local_440._4_4_;
    fVar309 = fStack_1f8 * fVar259 +
              fStack_278 * fVar307 + fVar281 * fStack_4b8 + fVar258 * fStack_438;
    fVar315 = fStack_1f4 * fVar263 +
              fStack_274 * fVar313 + fVar282 * fStack_4b4 + fVar262 * fStack_434;
    fStack_850 = fStack_1f0 * fVar266 +
                 fStack_270 * fVar318 + fVar283 * fStack_4b0 + fVar265 * fStack_430;
    fStack_84c = fStack_1ec * fVar269 +
                 fStack_26c * fVar322 + fVar284 * fStack_4ac + fVar268 * fStack_42c;
    fStack_848 = fStack_1e8 * fVar272 +
                 fStack_268 * fVar326 + fVar285 * fStack_4a8 + fVar271 * fStack_428;
    fStack_844 = fVar331 + fVar372 + auVar378._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_220._0_4_ * fVar300 +
         fVar287 * (float)local_3e0._0_4_ +
         fVar286 * (float)local_460._0_4_ + fVar274 * (float)local_4e0._0_4_;
    local_ae0._4_4_ =
         (float)local_220._4_4_ * fVar312 +
         fVar301 * (float)local_3e0._4_4_ +
         fVar306 * (float)local_460._4_4_ + fVar280 * (float)local_4e0._4_4_;
    fStack_ad8 = fStack_218 * fVar259 +
                 fVar307 * fStack_3d8 + fVar258 * fStack_458 + fVar281 * fStack_4d8;
    fStack_ad4 = fStack_214 * fVar263 +
                 fVar313 * fStack_3d4 + fVar262 * fStack_454 + fVar282 * fStack_4d4;
    fStack_ad0 = fStack_210 * fVar266 +
                 fVar318 * fStack_3d0 + fVar265 * fStack_450 + fVar283 * fStack_4d0;
    fStack_acc = fStack_20c * fVar269 +
                 fVar322 * fStack_3cc + fVar268 * fStack_44c + fVar284 * fStack_4cc;
    fStack_ac8 = fStack_208 * fVar272 +
                 fVar326 * fStack_3c8 + fVar271 * fStack_448 + fVar285 * fStack_4c8;
    fStack_ac4 = auVar254._28_4_ + fVar330 + fVar339 + auVar279._28_4_;
    auVar27._4_4_ = auVar202._4_4_ * -auVar202._4_4_;
    auVar27._0_4_ = auVar202._0_4_ * -auVar202._0_4_;
    auVar27._8_4_ = auVar202._8_4_ * -auVar202._8_4_;
    auVar27._12_4_ = auVar202._12_4_ * -auVar202._12_4_;
    auVar27._16_4_ = auVar202._16_4_ * -auVar202._16_4_;
    auVar27._20_4_ = auVar202._20_4_ * -auVar202._20_4_;
    auVar27._24_4_ = auVar202._24_4_ * -auVar202._24_4_;
    auVar27._28_4_ = auVar202._28_4_;
    auVar24._4_4_ = fVar241 * 4.0;
    auVar24._0_4_ = fVar223 * 4.0;
    auVar24._8_4_ = fVar242 * 4.0;
    auVar24._12_4_ = fVar243 * 4.0;
    auVar24._16_4_ = fVar244 * 4.0;
    auVar24._20_4_ = fVar245 * 4.0;
    auVar24._24_4_ = fVar246 * 4.0;
    auVar24._28_4_ = fVar247;
    auVar113 = vsubps_avx(auVar27,auVar24);
    fVar271 = fVar255 * -fVar255 * 0.5;
    fVar272 = fVar257 * -fVar257 * 0.5;
    fVar274 = fVar261 * -fVar261 * 0.5;
    fVar280 = fVar183 * -fVar183 * 0.5;
    fVar281 = fVar184 * -fVar184 * 0.5;
    fVar282 = fVar185 * -fVar185 * 0.5;
    fVar283 = fVar158 * -fVar158 * 0.5;
    fVar258 = auVar113._0_4_ * 0.5;
    fVar259 = auVar113._4_4_ * 0.5;
    fVar262 = auVar113._8_4_ * 0.5;
    fVar265 = auVar113._12_4_ * 0.5;
    fVar266 = auVar113._16_4_ * 0.5;
    fVar268 = auVar113._20_4_ * 0.5;
    fVar269 = auVar113._24_4_ * 0.5;
    fVar286 = (fVar255 * fVar255 + fVar223 * 4.0) * 0.5;
    fVar300 = (fVar257 * fVar257 + fVar241 * 4.0) * 0.5;
    fVar306 = (fVar261 * fVar261 + fVar242 * 4.0) * 0.5;
    fVar312 = (fVar183 * fVar183 + fVar243 * 4.0) * 0.5;
    fVar244 = (fVar184 * fVar184 + fVar244 * 4.0) * 0.5;
    fVar245 = (fVar185 * fVar185 + fVar245 * 4.0) * 0.5;
    fVar246 = (fVar158 * fVar158 + fVar246 * 4.0) * 0.5;
    fVar255 = auVar202._0_4_ * auVar202._0_4_ * 0.5;
    fVar257 = auVar202._4_4_ * auVar202._4_4_ * 0.5;
    fVar261 = auVar202._8_4_ * auVar202._8_4_ * 0.5;
    fVar158 = auVar202._12_4_ * auVar202._12_4_ * 0.5;
    fVar223 = auVar202._16_4_ * auVar202._16_4_ * 0.5;
    fVar241 = auVar202._20_4_ * auVar202._20_4_ * 0.5;
    fVar243 = auVar202._24_4_ * auVar202._24_4_ * 0.5;
    fVar263 = auVar113._28_4_ + fVar182 + fVar247 + fVar340 + fVar247;
    auVar193 = vpermilps_avx(ZEXT416((uint)(auVar21._0_4_ * 0.04761905)),0);
    fVar183 = auVar193._0_4_;
    fVar290 = fVar183 * (fVar124 * fVar271 +
                        (float)local_240._0_4_ * fVar258 +
                        fVar286 * (float)local_400._0_4_ + fVar255 * (float)local_480._0_4_);
    fVar184 = auVar193._4_4_;
    fVar304 = fVar184 * (fVar126 * fVar272 +
                        (float)local_240._4_4_ * fVar259 +
                        fVar300 * (float)local_400._4_4_ + fVar257 * (float)local_480._4_4_);
    auVar33._4_4_ = fVar304;
    auVar33._0_4_ = fVar290;
    fVar185 = auVar193._8_4_;
    fVar310 = fVar185 * (fVar128 * fVar274 +
                        fStack_238 * fVar262 + fVar306 * fStack_3f8 + fVar261 * fStack_478);
    auVar33._8_4_ = fVar310;
    fVar242 = auVar193._12_4_;
    fVar316 = fVar242 * (auVar19._12_4_ * fVar280 +
                        fStack_234 * fVar265 + fVar312 * fStack_3f4 + fVar158 * fStack_474);
    auVar33._12_4_ = fVar316;
    fVar320 = fVar183 * (fVar124 * fVar281 +
                        fStack_230 * fVar266 + fVar244 * fStack_3f0 + fVar223 * fStack_470);
    auVar33._16_4_ = fVar320;
    fVar324 = fVar184 * (fVar126 * fVar282 +
                        fStack_22c * fVar268 + fVar245 * fStack_3ec + fVar241 * fStack_46c);
    auVar33._20_4_ = fVar324;
    fVar328 = fVar185 * (fVar128 * fVar283 +
                        fStack_228 * fVar269 + fVar246 * fStack_3e8 + fVar243 * fStack_468);
    auVar33._24_4_ = fVar328;
    auVar33._28_4_ = fStack_844 + fVar340;
    fVar341 = fVar183 * ((float)local_1e0._0_4_ * fVar271 +
                        (float)local_260._0_4_ * fVar258 +
                        fVar286 * (float)local_420._0_4_ + fVar255 * (float)local_4a0._0_4_);
    fVar349 = fVar184 * ((float)local_1e0._4_4_ * fVar272 +
                        (float)local_260._4_4_ * fVar259 +
                        fVar300 * (float)local_420._4_4_ + fVar257 * (float)local_4a0._4_4_);
    auVar34._4_4_ = fVar349;
    auVar34._0_4_ = fVar341;
    fVar350 = fVar185 * (fStack_1d8 * fVar274 +
                        fStack_258 * fVar262 + fVar306 * fStack_418 + fVar261 * fStack_498);
    auVar34._8_4_ = fVar350;
    fVar351 = fVar242 * (fStack_1d4 * fVar280 +
                        fStack_254 * fVar265 + fVar312 * fStack_414 + fVar158 * fStack_494);
    auVar34._12_4_ = fVar351;
    fVar352 = fVar183 * (fStack_1d0 * fVar281 +
                        fStack_250 * fVar266 + fVar244 * fStack_410 + fVar223 * fStack_490);
    auVar34._16_4_ = fVar352;
    fVar353 = fVar184 * (fStack_1cc * fVar282 +
                        fStack_24c * fVar268 + fVar245 * fStack_40c + fVar241 * fStack_48c);
    auVar34._20_4_ = fVar353;
    fVar354 = fVar185 * (fStack_1c8 * fVar283 +
                        fStack_248 * fVar269 + fVar246 * fStack_408 + fVar243 * fStack_488);
    auVar34._24_4_ = fVar354;
    auVar34._28_4_ = uStack_1e4;
    fVar355 = fVar183 * ((float)local_200._0_4_ * fVar271 +
                        fVar255 * (float)local_4c0._0_4_ + fVar286 * (float)local_440._0_4_ +
                        (float)local_280._0_4_ * fVar258);
    fVar360 = fVar184 * ((float)local_200._4_4_ * fVar272 +
                        fVar257 * (float)local_4c0._4_4_ + fVar300 * (float)local_440._4_4_ +
                        (float)local_280._4_4_ * fVar259);
    local_a00._4_4_ = fVar360;
    local_a00._0_4_ = fVar355;
    fVar362 = fVar185 * (fStack_1f8 * fVar274 +
                        fVar261 * fStack_4b8 + fVar306 * fStack_438 + fStack_278 * fVar262);
    local_a00._8_4_ = fVar362;
    fVar364 = fVar242 * (fStack_1f4 * fVar280 +
                        fVar158 * fStack_4b4 + fVar312 * fStack_434 + fStack_274 * fVar265);
    local_a00._12_4_ = fVar364;
    fVar366 = fVar183 * (fStack_1f0 * fVar281 +
                        fVar223 * fStack_4b0 + fVar244 * fStack_430 + fStack_270 * fVar266);
    local_a00._16_4_ = fVar366;
    fVar368 = fVar184 * (fStack_1ec * fVar282 +
                        fVar241 * fStack_4ac + fVar245 * fStack_42c + fStack_26c * fVar268);
    local_a00._20_4_ = fVar368;
    fVar370 = fVar185 * (fStack_1e8 * fVar283 +
                        fVar243 * fStack_4a8 + fVar246 * fStack_428 + fStack_268 * fVar269);
    local_a00._24_4_ = fVar370;
    local_a00._28_4_ = fStack_204;
    fVar286 = fVar183 * ((float)local_220._0_4_ * fVar271 +
                        fVar258 * (float)local_3e0._0_4_ +
                        fVar255 * (float)local_4e0._0_4_ + fVar286 * (float)local_460._0_4_);
    fVar258 = fVar184 * ((float)local_220._4_4_ * fVar272 +
                        fVar259 * (float)local_3e0._4_4_ +
                        fVar257 * (float)local_4e0._4_4_ + fVar300 * (float)local_460._4_4_);
    auVar28._4_4_ = fVar258;
    auVar28._0_4_ = fVar286;
    fVar259 = fVar185 * (fStack_218 * fVar274 +
                        fVar262 * fStack_3d8 + fVar261 * fStack_4d8 + fVar306 * fStack_458);
    auVar28._8_4_ = fVar259;
    fVar242 = fVar242 * (fStack_214 * fVar280 +
                        fVar265 * fStack_3d4 + fVar158 * fStack_4d4 + fVar312 * fStack_454);
    auVar28._12_4_ = fVar242;
    fVar183 = fVar183 * (fStack_210 * fVar281 +
                        fVar266 * fStack_3d0 + fVar223 * fStack_4d0 + fVar244 * fStack_450);
    auVar28._16_4_ = fVar183;
    fVar184 = fVar184 * (fStack_20c * fVar282 +
                        fVar268 * fStack_3cc + fVar241 * fStack_4cc + fVar245 * fStack_44c);
    auVar28._20_4_ = fVar184;
    fVar185 = fVar185 * (fStack_208 * fVar283 +
                        fVar269 * fStack_3c8 + fVar243 * fStack_4c8 + fVar246 * fStack_448);
    auVar28._24_4_ = fVar185;
    auVar28._28_4_ = fVar263;
    auVar26._4_4_ = fVar302;
    auVar26._0_4_ = fVar288;
    auVar26._8_4_ = fVar308;
    auVar26._12_4_ = fVar314;
    auVar26._16_4_ = fVar319;
    auVar26._20_4_ = fVar323;
    auVar26._24_4_ = fVar327;
    auVar26._28_4_ = fVar331;
    auVar113 = vperm2f128_avx(auVar26,auVar26,1);
    auVar113 = vshufps_avx(auVar113,auVar26,0x30);
    auVar24 = vshufps_avx(auVar26,auVar113,0x29);
    auVar81._4_4_ = fVar303;
    auVar81._0_4_ = fVar289;
    auVar81._8_4_ = fVar309;
    auVar81._12_4_ = fVar315;
    auVar81._16_4_ = fStack_850;
    auVar81._20_4_ = fStack_84c;
    auVar81._24_4_ = fStack_848;
    auVar81._28_4_ = fStack_844;
    auVar113 = vperm2f128_avx(auVar81,auVar81,1);
    auVar113 = vshufps_avx(auVar113,auVar81,0x30);
    local_8a0 = vshufps_avx(auVar81,auVar113,0x29);
    auVar201 = vsubps_avx(_local_ae0,auVar28);
    auVar113 = vperm2f128_avx(auVar201,auVar201,1);
    auVar113 = vshufps_avx(auVar113,auVar201,0x30);
    local_780 = vshufps_avx(auVar201,auVar113,0x29);
    auVar26 = vsubps_avx(auVar24,auVar26);
    auVar115 = vsubps_avx(local_8a0,auVar81);
    fVar255 = auVar26._0_4_;
    fVar158 = auVar26._4_4_;
    auVar29._4_4_ = fVar360 * fVar158;
    auVar29._0_4_ = fVar355 * fVar255;
    fVar300 = auVar26._8_4_;
    auVar29._8_4_ = fVar362 * fVar300;
    fVar245 = auVar26._12_4_;
    auVar29._12_4_ = fVar364 * fVar245;
    fVar268 = auVar26._16_4_;
    auVar29._16_4_ = fVar366 * fVar268;
    fVar281 = auVar26._20_4_;
    auVar29._20_4_ = fVar368 * fVar281;
    fVar301 = auVar26._24_4_;
    auVar29._24_4_ = fVar370 * fVar301;
    auVar29._28_4_ = auVar201._28_4_;
    fVar257 = auVar115._0_4_;
    fVar223 = auVar115._4_4_;
    auVar30._4_4_ = fVar349 * fVar223;
    auVar30._0_4_ = fVar341 * fVar257;
    fVar306 = auVar115._8_4_;
    auVar30._8_4_ = fVar350 * fVar306;
    fVar246 = auVar115._12_4_;
    auVar30._12_4_ = fVar351 * fVar246;
    fVar269 = auVar115._16_4_;
    auVar30._16_4_ = fVar352 * fVar269;
    fVar282 = auVar115._20_4_;
    auVar30._20_4_ = fVar353 * fVar282;
    fVar307 = auVar115._24_4_;
    auVar30._24_4_ = fVar354 * fVar307;
    auVar30._28_4_ = auVar113._28_4_;
    auVar27 = vsubps_avx(auVar30,auVar29);
    auVar78._4_4_ = fStack_87c;
    auVar78._0_4_ = local_880;
    auVar78._8_4_ = fStack_878;
    auVar78._12_4_ = fStack_874;
    auVar78._16_4_ = fStack_870;
    auVar78._20_4_ = fStack_86c;
    auVar78._24_4_ = fStack_868;
    auVar78._28_4_ = fStack_864;
    auVar113 = vperm2f128_avx(auVar78,auVar78,1);
    auVar113 = vshufps_avx(auVar113,auVar78,0x30);
    local_a20 = vshufps_avx(auVar78,auVar113,0x29);
    local_2c0 = vsubps_avx(local_a20,auVar78);
    auVar31._4_4_ = fVar304 * fVar223;
    auVar31._0_4_ = fVar290 * fVar257;
    auVar31._8_4_ = fVar310 * fVar306;
    auVar31._12_4_ = fVar316 * fVar246;
    auVar31._16_4_ = fVar320 * fVar269;
    auVar31._20_4_ = fVar324 * fVar282;
    auVar31._24_4_ = fVar328 * fVar307;
    auVar31._28_4_ = auVar113._28_4_;
    fVar261 = local_2c0._0_4_;
    fVar241 = local_2c0._4_4_;
    auVar32._4_4_ = fVar360 * fVar241;
    auVar32._0_4_ = fVar355 * fVar261;
    fVar312 = local_2c0._8_4_;
    auVar32._8_4_ = fVar362 * fVar312;
    fVar262 = local_2c0._12_4_;
    auVar32._12_4_ = fVar364 * fVar262;
    fVar271 = local_2c0._16_4_;
    auVar32._16_4_ = fVar366 * fVar271;
    fVar283 = local_2c0._20_4_;
    auVar32._20_4_ = fVar368 * fVar283;
    fVar313 = local_2c0._24_4_;
    auVar32._24_4_ = fVar370 * fVar313;
    auVar32._28_4_ = local_8a0._28_4_;
    auVar28 = vsubps_avx(auVar32,auVar31);
    auVar296._4_4_ = fVar349 * fVar241;
    auVar296._0_4_ = fVar341 * fVar261;
    auVar296._8_4_ = fVar350 * fVar312;
    auVar296._12_4_ = fVar351 * fVar262;
    auVar296._16_4_ = fVar352 * fVar271;
    auVar296._20_4_ = fVar353 * fVar283;
    auVar296._24_4_ = fVar354 * fVar313;
    auVar296._28_4_ = local_8a0._28_4_;
    auVar23._4_4_ = fVar304 * fVar158;
    auVar23._0_4_ = fVar290 * fVar255;
    auVar23._8_4_ = fVar310 * fVar300;
    auVar23._12_4_ = fVar316 * fVar245;
    auVar23._16_4_ = fVar320 * fVar268;
    auVar23._20_4_ = fVar324 * fVar281;
    auVar23._24_4_ = fVar328 * fVar301;
    auVar23._28_4_ = fVar340;
    auVar29 = vsubps_avx(auVar23,auVar296);
    fVar247 = auVar29._28_4_;
    fVar243 = auVar28._28_4_ + fVar247;
    auVar203._0_4_ = fVar261 * fVar261 + fVar255 * fVar255 + fVar257 * fVar257;
    auVar203._4_4_ = fVar241 * fVar241 + fVar158 * fVar158 + fVar223 * fVar223;
    auVar203._8_4_ = fVar312 * fVar312 + fVar300 * fVar300 + fVar306 * fVar306;
    auVar203._12_4_ = fVar262 * fVar262 + fVar245 * fVar245 + fVar246 * fVar246;
    auVar203._16_4_ = fVar271 * fVar271 + fVar268 * fVar268 + fVar269 * fVar269;
    auVar203._20_4_ = fVar283 * fVar283 + fVar281 * fVar281 + fVar282 * fVar282;
    auVar203._24_4_ = fVar313 * fVar313 + fVar301 * fVar301 + fVar307 * fVar307;
    auVar203._28_4_ = fVar247 + fVar247 + fVar243;
    auVar113 = vrcpps_avx(auVar203);
    fVar244 = auVar113._0_4_;
    fVar265 = auVar113._4_4_;
    auVar25._4_4_ = fVar265 * auVar203._4_4_;
    auVar25._0_4_ = fVar244 * auVar203._0_4_;
    fVar266 = auVar113._8_4_;
    auVar25._8_4_ = fVar266 * auVar203._8_4_;
    fVar272 = auVar113._12_4_;
    auVar25._12_4_ = fVar272 * auVar203._12_4_;
    fVar274 = auVar113._16_4_;
    auVar25._16_4_ = fVar274 * auVar203._16_4_;
    fVar280 = auVar113._20_4_;
    auVar25._20_4_ = fVar280 * auVar203._20_4_;
    fVar284 = auVar113._24_4_;
    auVar25._24_4_ = fVar284 * auVar203._24_4_;
    auVar25._28_4_ = fVar340;
    auVar376._8_4_ = 0x3f800000;
    auVar376._0_8_ = 0x3f8000003f800000;
    auVar376._12_4_ = 0x3f800000;
    auVar376._16_4_ = 0x3f800000;
    auVar376._20_4_ = 0x3f800000;
    auVar376._24_4_ = 0x3f800000;
    auVar376._28_4_ = 0x3f800000;
    auVar30 = vsubps_avx(auVar376,auVar25);
    fVar244 = auVar30._0_4_ * fVar244 + fVar244;
    fVar265 = auVar30._4_4_ * fVar265 + fVar265;
    fVar266 = auVar30._8_4_ * fVar266 + fVar266;
    fVar272 = auVar30._12_4_ * fVar272 + fVar272;
    fVar274 = auVar30._16_4_ * fVar274 + fVar274;
    fVar280 = auVar30._20_4_ * fVar280 + fVar280;
    fVar284 = auVar30._24_4_ * fVar284 + fVar284;
    auVar201 = vperm2f128_avx(auVar34,auVar34,1);
    auVar201 = vshufps_avx(auVar201,auVar34,0x30);
    local_8c0 = vshufps_avx(auVar34,auVar201,0x29);
    auVar201 = vperm2f128_avx(local_a00,local_a00,1);
    auVar201 = vshufps_avx(auVar201,local_a00,0x30);
    local_720 = vshufps_avx(local_a00,auVar201,0x29);
    fVar356 = local_720._0_4_;
    fVar361 = local_720._4_4_;
    auVar35._4_4_ = fVar361 * fVar158;
    auVar35._0_4_ = fVar356 * fVar255;
    fVar363 = local_720._8_4_;
    auVar35._8_4_ = fVar363 * fVar300;
    fVar365 = local_720._12_4_;
    auVar35._12_4_ = fVar365 * fVar245;
    fVar367 = local_720._16_4_;
    auVar35._16_4_ = fVar367 * fVar268;
    fVar369 = local_720._20_4_;
    auVar35._20_4_ = fVar369 * fVar281;
    fVar371 = local_720._24_4_;
    auVar35._24_4_ = fVar371 * fVar301;
    auVar35._28_4_ = auVar201._28_4_;
    fVar373 = local_8c0._0_4_;
    fVar379 = local_8c0._4_4_;
    auVar36._4_4_ = fVar379 * fVar223;
    auVar36._0_4_ = fVar373 * fVar257;
    fVar380 = local_8c0._8_4_;
    auVar36._8_4_ = fVar380 * fVar306;
    fVar381 = local_8c0._12_4_;
    auVar36._12_4_ = fVar381 * fVar246;
    fVar382 = local_8c0._16_4_;
    auVar36._16_4_ = fVar382 * fVar269;
    fVar383 = local_8c0._20_4_;
    auVar36._20_4_ = fVar383 * fVar282;
    fVar384 = local_8c0._24_4_;
    auVar36._24_4_ = fVar384 * fVar307;
    auVar36._28_4_ = uStack_1e4;
    auVar31 = vsubps_avx(auVar36,auVar35);
    auVar201 = vperm2f128_avx(auVar33,auVar33,1);
    auVar201 = vshufps_avx(auVar201,auVar33,0x30);
    local_8e0 = vshufps_avx(auVar33,auVar201,0x29);
    fVar291 = local_8e0._0_4_;
    fVar305 = local_8e0._4_4_;
    auVar37._4_4_ = fVar305 * fVar223;
    auVar37._0_4_ = fVar291 * fVar257;
    fVar311 = local_8e0._8_4_;
    auVar37._8_4_ = fVar311 * fVar306;
    fVar317 = local_8e0._12_4_;
    auVar37._12_4_ = fVar317 * fVar246;
    fVar321 = local_8e0._16_4_;
    auVar37._16_4_ = fVar321 * fVar269;
    fVar325 = local_8e0._20_4_;
    auVar37._20_4_ = fVar325 * fVar282;
    fVar329 = local_8e0._24_4_;
    auVar37._24_4_ = fVar329 * fVar307;
    auVar37._28_4_ = auVar201._28_4_;
    auVar38._4_4_ = fVar361 * fVar241;
    auVar38._0_4_ = fVar356 * fVar261;
    auVar38._8_4_ = fVar363 * fVar312;
    auVar38._12_4_ = fVar365 * fVar262;
    auVar38._16_4_ = fVar367 * fVar271;
    auVar38._20_4_ = fVar369 * fVar283;
    uVar94 = local_720._28_4_;
    auVar38._24_4_ = fVar371 * fVar313;
    auVar38._28_4_ = uVar94;
    auVar201 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar379 * fVar241;
    auVar39._0_4_ = fVar373 * fVar261;
    auVar39._8_4_ = fVar380 * fVar312;
    auVar39._12_4_ = fVar381 * fVar262;
    auVar39._16_4_ = fVar382 * fVar271;
    auVar39._20_4_ = fVar383 * fVar283;
    auVar39._24_4_ = fVar384 * fVar313;
    auVar39._28_4_ = uVar94;
    auVar40._4_4_ = fVar305 * fVar158;
    auVar40._0_4_ = fVar291 * fVar255;
    auVar40._8_4_ = fVar311 * fVar300;
    auVar40._12_4_ = fVar317 * fVar245;
    auVar40._16_4_ = fVar321 * fVar268;
    auVar40._20_4_ = fVar325 * fVar281;
    auVar40._24_4_ = fVar329 * fVar301;
    auVar40._28_4_ = local_8c0._28_4_;
    auVar32 = vsubps_avx(auVar40,auVar39);
    fVar247 = auVar32._28_4_;
    fVar287 = auVar201._28_4_ + fVar247;
    auVar41._4_4_ =
         (auVar27._4_4_ * auVar27._4_4_ +
         auVar28._4_4_ * auVar28._4_4_ + auVar29._4_4_ * auVar29._4_4_) * fVar265;
    auVar41._0_4_ =
         (auVar27._0_4_ * auVar27._0_4_ +
         auVar28._0_4_ * auVar28._0_4_ + auVar29._0_4_ * auVar29._0_4_) * fVar244;
    auVar41._8_4_ =
         (auVar27._8_4_ * auVar27._8_4_ +
         auVar28._8_4_ * auVar28._8_4_ + auVar29._8_4_ * auVar29._8_4_) * fVar266;
    auVar41._12_4_ =
         (auVar27._12_4_ * auVar27._12_4_ +
         auVar28._12_4_ * auVar28._12_4_ + auVar29._12_4_ * auVar29._12_4_) * fVar272;
    auVar41._16_4_ =
         (auVar27._16_4_ * auVar27._16_4_ +
         auVar28._16_4_ * auVar28._16_4_ + auVar29._16_4_ * auVar29._16_4_) * fVar274;
    auVar41._20_4_ =
         (auVar27._20_4_ * auVar27._20_4_ +
         auVar28._20_4_ * auVar28._20_4_ + auVar29._20_4_ * auVar29._20_4_) * fVar280;
    auVar41._24_4_ =
         (auVar27._24_4_ * auVar27._24_4_ +
         auVar28._24_4_ * auVar28._24_4_ + auVar29._24_4_ * auVar29._24_4_) * fVar284;
    auVar41._28_4_ = auVar27._28_4_ + fVar243;
    auVar42._4_4_ =
         (auVar31._4_4_ * auVar31._4_4_ +
         auVar201._4_4_ * auVar201._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar265;
    auVar42._0_4_ =
         (auVar31._0_4_ * auVar31._0_4_ +
         auVar201._0_4_ * auVar201._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar244;
    auVar42._8_4_ =
         (auVar31._8_4_ * auVar31._8_4_ +
         auVar201._8_4_ * auVar201._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar266;
    auVar42._12_4_ =
         (auVar31._12_4_ * auVar31._12_4_ +
         auVar201._12_4_ * auVar201._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar272;
    auVar42._16_4_ =
         (auVar31._16_4_ * auVar31._16_4_ +
         auVar201._16_4_ * auVar201._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar274;
    auVar42._20_4_ =
         (auVar31._20_4_ * auVar31._20_4_ +
         auVar201._20_4_ * auVar201._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar280;
    auVar42._24_4_ =
         (auVar31._24_4_ * auVar31._24_4_ +
         auVar201._24_4_ * auVar201._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar284;
    auVar42._28_4_ = auVar30._28_4_ + auVar113._28_4_;
    auVar113 = vmaxps_avx(auVar41,auVar42);
    auVar201 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar201 = vshufps_avx(auVar201,_local_ae0,0x30);
    auVar28 = vshufps_avx(_local_ae0,auVar201,0x29);
    auVar171._0_4_ = (float)local_ae0._0_4_ + fVar286;
    auVar171._4_4_ = (float)local_ae0._4_4_ + fVar258;
    auVar171._8_4_ = fStack_ad8 + fVar259;
    auVar171._12_4_ = fStack_ad4 + fVar242;
    auVar171._16_4_ = fStack_ad0 + fVar183;
    auVar171._20_4_ = fStack_acc + fVar184;
    auVar171._24_4_ = fStack_ac8 + fVar185;
    auVar171._28_4_ = fStack_ac4 + fVar263;
    auVar201 = vmaxps_avx(_local_ae0,auVar171);
    auVar27 = vmaxps_avx(local_780,auVar28);
    auVar201 = vmaxps_avx(auVar201,auVar27);
    auVar27 = vrsqrtps_avx(auVar203);
    fVar183 = auVar27._0_4_;
    fVar184 = auVar27._4_4_;
    fVar185 = auVar27._8_4_;
    fVar242 = auVar27._12_4_;
    fVar243 = auVar27._16_4_;
    fVar286 = auVar27._20_4_;
    fVar258 = auVar27._24_4_;
    auVar43._4_4_ = fVar184 * fVar184 * fVar184 * auVar203._4_4_ * 0.5;
    auVar43._0_4_ = fVar183 * fVar183 * fVar183 * auVar203._0_4_ * 0.5;
    auVar43._8_4_ = fVar185 * fVar185 * fVar185 * auVar203._8_4_ * 0.5;
    auVar43._12_4_ = fVar242 * fVar242 * fVar242 * auVar203._12_4_ * 0.5;
    auVar43._16_4_ = fVar243 * fVar243 * fVar243 * auVar203._16_4_ * 0.5;
    auVar43._20_4_ = fVar286 * fVar286 * fVar286 * auVar203._20_4_ * 0.5;
    auVar43._24_4_ = fVar258 * fVar258 * fVar258 * auVar203._24_4_ * 0.5;
    auVar43._28_4_ = auVar203._28_4_;
    auVar44._4_4_ = fVar184 * 1.5;
    auVar44._0_4_ = fVar183 * 1.5;
    auVar44._8_4_ = fVar185 * 1.5;
    auVar44._12_4_ = fVar242 * 1.5;
    auVar44._16_4_ = fVar243 * 1.5;
    auVar44._20_4_ = fVar286 * 1.5;
    auVar44._24_4_ = fVar258 * 1.5;
    auVar44._28_4_ = auVar27._28_4_;
    local_520 = vsubps_avx(auVar44,auVar43);
    auVar77._4_4_ = fVar302;
    auVar77._0_4_ = fVar288;
    auVar77._8_4_ = fVar308;
    auVar77._12_4_ = fVar314;
    auVar77._16_4_ = fVar319;
    auVar77._20_4_ = fVar323;
    auVar77._24_4_ = fVar327;
    auVar77._28_4_ = fVar331;
    auVar29 = vsubps_avx(ZEXT832(0) << 0x20,auVar77);
    auVar30 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    fVar388 = auVar30._0_4_;
    fVar391 = auVar30._4_4_;
    fVar392 = auVar30._8_4_;
    fVar393 = auVar30._12_4_;
    fVar394 = auVar30._16_4_;
    fVar395 = auVar30._20_4_;
    fVar396 = auVar30._24_4_;
    fVar183 = auVar29._0_4_;
    fVar242 = auVar29._4_4_;
    fVar258 = auVar29._8_4_;
    fVar263 = auVar29._12_4_;
    fVar272 = auVar29._16_4_;
    fVar284 = auVar29._20_4_;
    fVar318 = auVar29._24_4_;
    auVar296 = ZEXT832(0) << 0x20;
    auVar30 = vsubps_avx(auVar296,auVar78);
    fVar184 = auVar30._0_4_;
    fVar243 = auVar30._4_4_;
    fVar259 = auVar30._8_4_;
    fVar265 = auVar30._12_4_;
    fVar274 = auVar30._16_4_;
    fVar285 = auVar30._20_4_;
    fVar322 = auVar30._24_4_;
    auVar336._0_4_ = local_620 * fVar184 + local_7a0 * fVar183 + fVar388 * local_7c0;
    auVar336._4_4_ = fStack_61c * fVar243 + fStack_79c * fVar242 + fVar391 * fStack_7bc;
    auVar336._8_4_ = fStack_618 * fVar259 + fStack_798 * fVar258 + fVar392 * fStack_7b8;
    auVar336._12_4_ = fStack_614 * fVar265 + fStack_794 * fVar263 + fVar393 * fStack_7b4;
    auVar336._16_4_ = fStack_610 * fVar274 + fStack_790 * fVar272 + fVar394 * fStack_7b0;
    auVar336._20_4_ = fStack_60c * fVar285 + fStack_78c * fVar284 + fVar395 * fStack_7ac;
    auVar336._24_4_ = fStack_608 * fVar322 + fStack_788 * fVar318 + fVar396 * fStack_7a8;
    auVar336._28_4_ = fVar287 + auVar31._28_4_ + fVar287 + auVar27._28_4_;
    auVar344._0_4_ = fVar184 * fVar184 + fVar183 * fVar183 + fVar388 * fVar388;
    auVar344._4_4_ = fVar243 * fVar243 + fVar242 * fVar242 + fVar391 * fVar391;
    auVar344._8_4_ = fVar259 * fVar259 + fVar258 * fVar258 + fVar392 * fVar392;
    auVar344._12_4_ = fVar265 * fVar265 + fVar263 * fVar263 + fVar393 * fVar393;
    auVar344._16_4_ = fVar274 * fVar274 + fVar272 * fVar272 + fVar394 * fVar394;
    auVar344._20_4_ = fVar285 * fVar285 + fVar284 * fVar284 + fVar395 * fVar395;
    auVar344._24_4_ = fVar322 * fVar322 + fVar318 * fVar318 + fVar396 * fVar396;
    auVar344._28_4_ = fVar247 + fVar247 + fVar287;
    fVar185 = local_520._0_4_;
    fVar286 = local_520._4_4_;
    fVar244 = local_520._8_4_;
    fVar266 = local_520._12_4_;
    fVar280 = local_520._16_4_;
    fVar287 = local_520._20_4_;
    fVar326 = local_520._24_4_;
    fVar330 = auVar115._28_4_;
    local_540 = local_620 * fVar185 * fVar261 +
                fVar255 * fVar185 * local_7a0 + fVar185 * fVar257 * local_7c0;
    fStack_53c = fStack_61c * fVar286 * fVar241 +
                 fVar158 * fVar286 * fStack_79c + fVar286 * fVar223 * fStack_7bc;
    fStack_538 = fStack_618 * fVar244 * fVar312 +
                 fVar300 * fVar244 * fStack_798 + fVar244 * fVar306 * fStack_7b8;
    fStack_534 = fStack_614 * fVar266 * fVar262 +
                 fVar245 * fVar266 * fStack_794 + fVar266 * fVar246 * fStack_7b4;
    fStack_530 = fStack_610 * fVar280 * fVar271 +
                 fVar268 * fVar280 * fStack_790 + fVar280 * fVar269 * fStack_7b0;
    fStack_52c = fStack_60c * fVar287 * fVar283 +
                 fVar281 * fVar287 * fStack_78c + fVar287 * fVar282 * fStack_7ac;
    fStack_528 = fStack_608 * fVar326 * fVar313 +
                 fVar301 * fVar326 * fStack_788 + fVar326 * fVar307 * fStack_7a8;
    fVar247 = fStack_604 + fVar330 + fStack_7a4;
    local_560 = fVar184 * fVar185 * fVar261 +
                fVar255 * fVar185 * fVar183 + fVar388 * fVar185 * fVar257;
    fStack_55c = fVar243 * fVar286 * fVar241 +
                 fVar158 * fVar286 * fVar242 + fVar391 * fVar286 * fVar223;
    fStack_558 = fVar259 * fVar244 * fVar312 +
                 fVar300 * fVar244 * fVar258 + fVar392 * fVar244 * fVar306;
    fStack_554 = fVar265 * fVar266 * fVar262 +
                 fVar245 * fVar266 * fVar263 + fVar393 * fVar266 * fVar246;
    fStack_550 = fVar274 * fVar280 * fVar271 +
                 fVar268 * fVar280 * fVar272 + fVar394 * fVar280 * fVar269;
    fStack_54c = fVar285 * fVar287 * fVar283 +
                 fVar281 * fVar287 * fVar284 + fVar395 * fVar287 * fVar282;
    fStack_548 = fVar322 * fVar326 * fVar313 +
                 fVar301 * fVar326 * fVar318 + fVar396 * fVar326 * fVar307;
    fStack_544 = fVar330 + fVar247;
    auVar115._4_4_ = fStack_53c * fStack_55c;
    auVar115._0_4_ = local_540 * local_560;
    auVar115._8_4_ = fStack_538 * fStack_558;
    auVar115._12_4_ = fStack_534 * fStack_554;
    auVar115._16_4_ = fStack_530 * fStack_550;
    auVar115._20_4_ = fStack_52c * fStack_54c;
    auVar115._24_4_ = fStack_528 * fStack_548;
    auVar115._28_4_ = fVar247;
    auVar115 = vsubps_avx(auVar336,auVar115);
    auVar45._4_4_ = fStack_55c * fStack_55c;
    auVar45._0_4_ = local_560 * local_560;
    auVar45._8_4_ = fStack_558 * fStack_558;
    auVar45._12_4_ = fStack_554 * fStack_554;
    auVar45._16_4_ = fStack_550 * fStack_550;
    auVar45._20_4_ = fStack_54c * fStack_54c;
    auVar45._24_4_ = fStack_548 * fStack_548;
    auVar45._28_4_ = fVar330;
    auVar31 = vsubps_avx(auVar344,auVar45);
    auVar27 = vsqrtps_avx(auVar113);
    fVar247 = (auVar27._0_4_ + auVar201._0_4_) * 1.0000002;
    fVar339 = (auVar27._4_4_ + auVar201._4_4_) * 1.0000002;
    fVar372 = (auVar27._8_4_ + auVar201._8_4_) * 1.0000002;
    fVar124 = (auVar27._12_4_ + auVar201._12_4_) * 1.0000002;
    fVar126 = (auVar27._16_4_ + auVar201._16_4_) * 1.0000002;
    fVar128 = (auVar27._20_4_ + auVar201._20_4_) * 1.0000002;
    fVar130 = (auVar27._24_4_ + auVar201._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar339 * fVar339;
    auVar46._0_4_ = fVar247 * fVar247;
    auVar46._8_4_ = fVar372 * fVar372;
    auVar46._12_4_ = fVar124 * fVar124;
    auVar46._16_4_ = fVar126 * fVar126;
    auVar46._20_4_ = fVar128 * fVar128;
    auVar46._24_4_ = fVar130 * fVar130;
    auVar46._28_4_ = auVar27._28_4_ + auVar201._28_4_;
    local_2e0._0_4_ = auVar115._0_4_ + auVar115._0_4_;
    local_2e0._4_4_ = auVar115._4_4_ + auVar115._4_4_;
    local_2e0._8_4_ = auVar115._8_4_ + auVar115._8_4_;
    local_2e0._12_4_ = auVar115._12_4_ + auVar115._12_4_;
    local_2e0._16_4_ = auVar115._16_4_ + auVar115._16_4_;
    local_2e0._20_4_ = auVar115._20_4_ + auVar115._20_4_;
    local_2e0._24_4_ = auVar115._24_4_ + auVar115._24_4_;
    fVar247 = auVar115._28_4_;
    local_2e0._28_4_ = fVar247 + fVar247;
    auVar201 = vsubps_avx(auVar31,auVar46);
    auVar47._4_4_ = fStack_53c * fStack_53c;
    auVar47._0_4_ = local_540 * local_540;
    auVar47._8_4_ = fStack_538 * fStack_538;
    auVar47._12_4_ = fStack_534 * fStack_534;
    auVar47._16_4_ = fStack_530 * fStack_530;
    auVar47._20_4_ = fStack_52c * fStack_52c;
    auVar47._24_4_ = fStack_528 * fStack_528;
    auVar47._28_4_ = fVar247;
    auVar348 = ZEXT3264(local_2a0);
    auVar115 = vsubps_avx(local_2a0,auVar47);
    auVar48._4_4_ = local_2e0._4_4_ * local_2e0._4_4_;
    auVar48._0_4_ = local_2e0._0_4_ * local_2e0._0_4_;
    auVar48._8_4_ = local_2e0._8_4_ * local_2e0._8_4_;
    auVar48._12_4_ = local_2e0._12_4_ * local_2e0._12_4_;
    auVar48._16_4_ = local_2e0._16_4_ * local_2e0._16_4_;
    auVar48._20_4_ = local_2e0._20_4_ * local_2e0._20_4_;
    auVar48._24_4_ = local_2e0._24_4_ * local_2e0._24_4_;
    auVar48._28_4_ = 0x3f800002;
    fVar247 = auVar115._0_4_;
    fVar339 = auVar115._4_4_;
    fVar372 = auVar115._8_4_;
    fVar124 = auVar115._12_4_;
    fVar126 = auVar115._16_4_;
    fVar128 = auVar115._20_4_;
    fVar130 = auVar115._24_4_;
    auVar49._4_4_ = auVar201._4_4_ * fVar339 * 4.0;
    auVar49._0_4_ = auVar201._0_4_ * fVar247 * 4.0;
    auVar49._8_4_ = auVar201._8_4_ * fVar372 * 4.0;
    auVar49._12_4_ = auVar201._12_4_ * fVar124 * 4.0;
    auVar49._16_4_ = auVar201._16_4_ * fVar126 * 4.0;
    auVar49._20_4_ = auVar201._20_4_ * fVar128 * 4.0;
    auVar49._24_4_ = auVar201._24_4_ * fVar130 * 4.0;
    auVar49._28_4_ = 0x40800000;
    auVar32 = vsubps_avx(auVar48,auVar49);
    auVar113 = vcmpps_avx(auVar32,auVar296,5);
    auVar277._8_4_ = 0x7fffffff;
    auVar277._0_8_ = 0x7fffffff7fffffff;
    auVar277._12_4_ = 0x7fffffff;
    auVar277._16_4_ = 0x7fffffff;
    auVar277._20_4_ = 0x7fffffff;
    auVar277._24_4_ = 0x7fffffff;
    auVar277._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar47,auVar277);
    local_320._0_4_ = fVar247 + fVar247;
    local_320._4_4_ = fVar339 + fVar339;
    local_320._8_4_ = fVar372 + fVar372;
    local_320._12_4_ = fVar124 + fVar124;
    local_320._16_4_ = fVar126 + fVar126;
    local_320._20_4_ = fVar128 + fVar128;
    local_320._24_4_ = fVar130 + fVar130;
    local_320._28_4_ = auVar115._28_4_ + auVar115._28_4_;
    _local_a40 = vandps_avx(auVar115,auVar277);
    uVar88 = CONCAT44(local_2e0._4_4_,local_2e0._0_4_);
    local_300._0_8_ = uVar88 ^ 0x8000000080000000;
    local_300._8_4_ = -local_2e0._8_4_;
    local_300._12_4_ = -local_2e0._12_4_;
    local_300._16_4_ = -local_2e0._16_4_;
    local_300._20_4_ = -local_2e0._20_4_;
    local_300._24_4_ = -local_2e0._24_4_;
    local_300._28_4_ = -local_2e0._28_4_;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0x7f,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar113 >> 0xbf,0) == '\0') &&
        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar113[0x1f])
    {
      auVar337._8_4_ = 0x7f800000;
      auVar337._0_8_ = 0x7f8000007f800000;
      auVar337._12_4_ = 0x7f800000;
      auVar337._16_4_ = 0x7f800000;
      auVar337._20_4_ = 0x7f800000;
      auVar337._24_4_ = 0x7f800000;
      auVar337._28_4_ = 0x7f800000;
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
    }
    else {
      auVar25 = vsqrtps_avx(auVar32);
      auVar23 = vrcpps_avx(local_320);
      auVar115 = vcmpps_avx(auVar32,auVar296,5);
      fVar97 = auVar23._0_4_;
      fVar122 = auVar23._4_4_;
      auVar50._4_4_ = local_320._4_4_ * fVar122;
      auVar50._0_4_ = local_320._0_4_ * fVar97;
      fVar123 = auVar23._8_4_;
      auVar50._8_4_ = local_320._8_4_ * fVar123;
      fVar125 = auVar23._12_4_;
      auVar50._12_4_ = local_320._12_4_ * fVar125;
      fVar127 = auVar23._16_4_;
      auVar50._16_4_ = local_320._16_4_ * fVar127;
      fVar129 = auVar23._20_4_;
      auVar50._20_4_ = local_320._20_4_ * fVar129;
      fVar131 = auVar23._24_4_;
      auVar50._24_4_ = local_320._24_4_ * fVar131;
      auVar50._28_4_ = auVar32._28_4_;
      auVar144._8_4_ = 0x3f800000;
      auVar144._0_8_ = 0x3f8000003f800000;
      auVar144._12_4_ = 0x3f800000;
      auVar144._16_4_ = 0x3f800000;
      auVar144._20_4_ = 0x3f800000;
      auVar144._24_4_ = 0x3f800000;
      auVar144._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar144,auVar50);
      fVar97 = fVar97 + fVar97 * auVar32._0_4_;
      fVar122 = fVar122 + fVar122 * auVar32._4_4_;
      fVar123 = fVar123 + fVar123 * auVar32._8_4_;
      fVar125 = fVar125 + fVar125 * auVar32._12_4_;
      fVar127 = fVar127 + fVar127 * auVar32._16_4_;
      fVar129 = fVar129 + fVar129 * auVar32._20_4_;
      fVar131 = fVar131 + fVar131 * auVar32._24_4_;
      auVar296 = vsubps_avx(local_300,auVar25);
      fVar248 = auVar296._0_4_ * fVar97;
      fVar256 = auVar296._4_4_ * fVar122;
      auVar51._4_4_ = fVar256;
      auVar51._0_4_ = fVar248;
      fVar260 = auVar296._8_4_ * fVar123;
      auVar51._8_4_ = fVar260;
      fVar264 = auVar296._12_4_ * fVar125;
      auVar51._12_4_ = fVar264;
      fVar267 = auVar296._16_4_ * fVar127;
      auVar51._16_4_ = fVar267;
      fVar270 = auVar296._20_4_ * fVar129;
      auVar51._20_4_ = fVar270;
      fVar273 = auVar296._24_4_ * fVar131;
      auVar51._24_4_ = fVar273;
      auVar51._28_4_ = auVar296._28_4_;
      auVar296 = vsubps_avx(auVar25,local_2e0);
      fVar97 = auVar296._0_4_ * fVar97;
      fVar122 = auVar296._4_4_ * fVar122;
      auVar52._4_4_ = fVar122;
      auVar52._0_4_ = fVar97;
      fVar123 = auVar296._8_4_ * fVar123;
      auVar52._8_4_ = fVar123;
      fVar125 = auVar296._12_4_ * fVar125;
      auVar52._12_4_ = fVar125;
      fVar127 = auVar296._16_4_ * fVar127;
      auVar52._16_4_ = fVar127;
      fVar129 = auVar296._20_4_ * fVar129;
      auVar52._20_4_ = fVar129;
      fVar131 = auVar296._24_4_ * fVar131;
      auVar52._24_4_ = fVar131;
      auVar52._28_4_ = auVar23._28_4_ + auVar32._28_4_;
      fStack_364 = fStack_544 + auVar296._28_4_;
      local_380 = fVar185 * (local_560 + local_540 * fVar248);
      fStack_37c = fVar286 * (fStack_55c + fStack_53c * fVar256);
      fStack_378 = fVar244 * (fStack_558 + fStack_538 * fVar260);
      fStack_374 = fVar266 * (fStack_554 + fStack_534 * fVar264);
      fStack_370 = fVar280 * (fStack_550 + fStack_530 * fVar267);
      fStack_36c = fVar287 * (fStack_54c + fStack_52c * fVar270);
      fStack_368 = fVar326 * (fStack_548 + fStack_528 * fVar273);
      local_360 = fVar185 * (local_560 + local_540 * fVar97);
      fStack_35c = fVar286 * (fStack_55c + fStack_53c * fVar122);
      fStack_358 = fVar244 * (fStack_558 + fStack_538 * fVar123);
      fStack_354 = fVar266 * (fStack_554 + fStack_534 * fVar125);
      fStack_350 = fVar280 * (fStack_550 + fStack_530 * fVar127);
      fStack_34c = fVar287 * (fStack_54c + fStack_52c * fVar129);
      fStack_348 = fVar326 * (fStack_548 + fStack_528 * fVar131);
      fStack_344 = fStack_544 + fStack_364;
      auVar231._8_4_ = 0x7f800000;
      auVar231._0_8_ = 0x7f8000007f800000;
      auVar231._12_4_ = 0x7f800000;
      auVar231._16_4_ = 0x7f800000;
      auVar231._20_4_ = 0x7f800000;
      auVar231._24_4_ = 0x7f800000;
      auVar231._28_4_ = 0x7f800000;
      auVar337 = vblendvps_avx(auVar231,auVar51,auVar115);
      auVar232._8_4_ = 0xff800000;
      auVar232._0_8_ = 0xff800000ff800000;
      auVar232._12_4_ = 0xff800000;
      auVar232._16_4_ = 0xff800000;
      auVar232._20_4_ = 0xff800000;
      auVar232._24_4_ = 0xff800000;
      auVar232._28_4_ = 0xff800000;
      auVar114 = vblendvps_avx(auVar232,auVar52,auVar115);
      auVar32 = vmaxps_avx(local_500,local_3a0);
      auVar53._4_4_ = auVar32._4_4_ * 1.9073486e-06;
      auVar53._0_4_ = auVar32._0_4_ * 1.9073486e-06;
      auVar53._8_4_ = auVar32._8_4_ * 1.9073486e-06;
      auVar53._12_4_ = auVar32._12_4_ * 1.9073486e-06;
      auVar53._16_4_ = auVar32._16_4_ * 1.9073486e-06;
      auVar53._20_4_ = auVar32._20_4_ * 1.9073486e-06;
      auVar53._24_4_ = auVar32._24_4_ * 1.9073486e-06;
      auVar53._28_4_ = auVar32._28_4_;
      auVar32 = vcmpps_avx(_local_a40,auVar53,1);
      auVar348 = ZEXT3264(auVar32);
      auVar296 = auVar115 & auVar32;
      if ((((((((auVar296 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar296 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar296 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar296 >> 0x7f,0) != '\0') ||
            (auVar296 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar296 >> 0xbf,0) != '\0') ||
          (auVar296 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar296[0x1f] < '\0') {
        auVar113 = vandps_avx(auVar32,auVar115);
        auVar193 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar32 = vcmpps_avx(auVar201,_DAT_01f7b000,2);
        auVar347._8_4_ = 0xff800000;
        auVar347._0_8_ = 0xff800000ff800000;
        auVar347._12_4_ = 0xff800000;
        auVar347._16_4_ = 0xff800000;
        auVar347._20_4_ = 0xff800000;
        auVar347._24_4_ = 0xff800000;
        auVar347._28_4_ = 0xff800000;
        auVar358._8_4_ = 0x7f800000;
        auVar358._0_8_ = 0x7f8000007f800000;
        auVar358._12_4_ = 0x7f800000;
        auVar358._16_4_ = 0x7f800000;
        auVar358._20_4_ = 0x7f800000;
        auVar358._24_4_ = 0x7f800000;
        auVar358._28_4_ = 0x7f800000;
        auVar201 = vblendvps_avx(auVar358,auVar347,auVar32);
        auVar20 = vpmovsxwd_avx(auVar193);
        auVar348 = ZEXT1664(auVar20);
        auVar193 = vpunpckhwd_avx(auVar193,auVar193);
        auVar239._16_16_ = auVar193;
        auVar239._0_16_ = auVar20;
        auVar337 = vblendvps_avx(auVar337,auVar201,auVar239);
        auVar278._8_4_ = 0xff800000;
        auVar278._0_8_ = 0xff800000ff800000;
        auVar278._12_4_ = 0xff800000;
        auVar278._16_4_ = 0xff800000;
        auVar278._20_4_ = 0xff800000;
        auVar278._24_4_ = 0xff800000;
        auVar278._28_4_ = 0xff800000;
        auVar201 = vblendvps_avx(auVar278,auVar358,auVar32);
        auVar114 = vblendvps_avx(auVar114,auVar201,auVar239);
        auVar178._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
        auVar178._8_4_ = auVar113._8_4_ ^ 0xffffffff;
        auVar178._12_4_ = auVar113._12_4_ ^ 0xffffffff;
        auVar178._16_4_ = auVar113._16_4_ ^ 0xffffffff;
        auVar178._20_4_ = auVar113._20_4_ ^ 0xffffffff;
        auVar178._24_4_ = auVar113._24_4_ ^ 0xffffffff;
        auVar178._28_4_ = auVar113._28_4_ ^ 0xffffffff;
        auVar113 = vorps_avx(auVar32,auVar178);
        auVar113 = vandps_avx(auVar115,auVar113);
      }
    }
    auVar377._4_4_ = fStack_7bc;
    auVar377._0_4_ = local_7c0;
    auVar18._4_4_ = fStack_79c;
    auVar18._0_4_ = local_7a0;
    auVar377._8_4_ = fStack_7b8;
    auVar18._8_4_ = fStack_798;
    auVar377._12_4_ = fStack_7b4;
    auVar18._12_4_ = fStack_794;
    auVar377._16_4_ = fStack_7b0;
    auVar18._16_4_ = fStack_790;
    auVar377._20_4_ = fStack_7ac;
    auVar18._20_4_ = fStack_78c;
    auVar377._24_4_ = fStack_7a8;
    auVar18._24_4_ = fStack_788;
    auVar377._28_4_ = fStack_7a4;
    auVar18._28_4_ = fStack_784;
    auVar279 = ZEXT3264(local_340);
    auVar115 = local_340 & auVar113;
    auVar201 = _local_a40;
    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar115 >> 0x7f,0) == '\0') &&
          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar115 >> 0xbf,0) == '\0') &&
        (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar115[0x1f])
    {
LAB_008c55e0:
      auVar359 = ZEXT3264(auVar18);
      auVar338 = ZEXT3264(auVar337);
      auVar378 = ZEXT3264(auVar377);
      auVar254 = ZEXT3264(auVar201);
    }
    else {
      fStack_524 = fStack_604 + fVar330 + fStack_7a4;
      auVar193 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_840._0_4_));
      auVar193 = vshufps_avx(auVar193,auVar193,0);
      auVar233._16_16_ = auVar193;
      auVar233._0_16_ = auVar193;
      auVar32 = vmaxps_avx(auVar233,auVar337);
      auVar193 = ZEXT416((uint)(ray->tfar - (float)local_840._0_4_));
      auVar193 = vshufps_avx(auVar193,auVar193,0);
      auVar234._16_16_ = auVar193;
      auVar234._0_16_ = auVar193;
      auVar296 = vminps_avx(auVar234,auVar114);
      fVar131 = auVar30._28_4_;
      auVar337._4_4_ = fStack_61c;
      auVar337._0_4_ = local_620;
      auVar337._8_4_ = fStack_618;
      auVar337._12_4_ = fStack_614;
      auVar337._16_4_ = fStack_610;
      auVar337._20_4_ = fStack_60c;
      auVar337._24_4_ = fStack_608;
      auVar337._28_4_ = fStack_604;
      auVar145._0_4_ = local_620 * fVar290 + local_7a0 * fVar341 + local_7c0 * fVar355;
      auVar145._4_4_ = fStack_61c * fVar304 + fStack_79c * fVar349 + fStack_7bc * fVar360;
      auVar145._8_4_ = fStack_618 * fVar310 + fStack_798 * fVar350 + fStack_7b8 * fVar362;
      auVar145._12_4_ = fStack_614 * fVar316 + fStack_794 * fVar351 + fStack_7b4 * fVar364;
      auVar145._16_4_ = fStack_610 * fVar320 + fStack_790 * fVar352 + fStack_7b0 * fVar366;
      auVar145._20_4_ = fStack_60c * fVar324 + fStack_78c * fVar353 + fStack_7ac * fVar368;
      auVar145._24_4_ = fStack_608 * fVar328 + fStack_788 * fVar354 + fStack_7a8 * fVar370;
      auVar145._28_4_ = fVar131 + fVar131 + fStack_204;
      auVar201 = vrcpps_avx(auVar145);
      fVar330 = auVar201._0_4_;
      fVar97 = auVar201._4_4_;
      auVar54._4_4_ = auVar145._4_4_ * fVar97;
      auVar54._0_4_ = auVar145._0_4_ * fVar330;
      fVar122 = auVar201._8_4_;
      auVar54._8_4_ = auVar145._8_4_ * fVar122;
      fVar123 = auVar201._12_4_;
      auVar54._12_4_ = auVar145._12_4_ * fVar123;
      fVar125 = auVar201._16_4_;
      auVar54._16_4_ = auVar145._16_4_ * fVar125;
      fVar127 = auVar201._20_4_;
      auVar54._20_4_ = auVar145._20_4_ * fVar127;
      fVar129 = auVar201._24_4_;
      auVar54._24_4_ = auVar145._24_4_ * fVar129;
      auVar54._28_4_ = fStack_844 + fVar340;
      auVar385._8_4_ = 0x3f800000;
      auVar385._0_8_ = 0x3f8000003f800000;
      auVar385._12_4_ = 0x3f800000;
      auVar385._16_4_ = 0x3f800000;
      auVar385._20_4_ = 0x3f800000;
      auVar385._24_4_ = 0x3f800000;
      auVar385._28_4_ = 0x3f800000;
      auVar115 = vsubps_avx(auVar385,auVar54);
      auVar297._8_4_ = 0x7fffffff;
      auVar297._0_8_ = 0x7fffffff7fffffff;
      auVar297._12_4_ = 0x7fffffff;
      auVar297._16_4_ = 0x7fffffff;
      auVar297._20_4_ = 0x7fffffff;
      auVar297._24_4_ = 0x7fffffff;
      auVar297._28_4_ = 0x7fffffff;
      auVar201 = vandps_avx(auVar297,auVar145);
      auVar397._8_4_ = 0x219392ef;
      auVar397._0_8_ = 0x219392ef219392ef;
      auVar397._12_4_ = 0x219392ef;
      auVar397._16_4_ = 0x219392ef;
      auVar397._20_4_ = 0x219392ef;
      auVar397._24_4_ = 0x219392ef;
      auVar397._28_4_ = 0x219392ef;
      auVar201 = vcmpps_avx(auVar201,auVar397,1);
      auVar55._4_4_ =
           (fVar97 + fVar97 * auVar115._4_4_) *
           -(fVar304 * fVar243 + fVar349 * fVar242 + fVar391 * fVar360);
      auVar55._0_4_ =
           (fVar330 + fVar330 * auVar115._0_4_) *
           -(fVar290 * fVar184 + fVar341 * fVar183 + fVar388 * fVar355);
      auVar55._8_4_ =
           (fVar122 + fVar122 * auVar115._8_4_) *
           -(fVar310 * fVar259 + fVar350 * fVar258 + fVar392 * fVar362);
      auVar55._12_4_ =
           (fVar123 + fVar123 * auVar115._12_4_) *
           -(fVar316 * fVar265 + fVar351 * fVar263 + fVar393 * fVar364);
      auVar55._16_4_ =
           (fVar125 + fVar125 * auVar115._16_4_) *
           -(fVar320 * fVar274 + fVar352 * fVar272 + fVar394 * fVar366);
      auVar55._20_4_ =
           (fVar127 + fVar127 * auVar115._20_4_) *
           -(fVar324 * fVar285 + fVar353 * fVar284 + fVar395 * fVar368);
      auVar55._24_4_ =
           (fVar129 + fVar129 * auVar115._24_4_) *
           -(fVar328 * fVar322 + fVar354 * fVar318 + fVar396 * fVar370);
      auVar55._28_4_ = -(fVar131 + auVar29._28_4_ + auVar193._12_4_);
      auVar115 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,1);
      auVar29 = vorps_avx(auVar201,auVar115);
      auVar115 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,6);
      auVar115 = vorps_avx(auVar201,auVar115);
      auVar377._8_4_ = 0xff800000;
      auVar377._0_8_ = 0xff800000ff800000;
      auVar377._12_4_ = 0xff800000;
      auVar377._16_4_ = 0xff800000;
      auVar377._20_4_ = 0xff800000;
      auVar377._24_4_ = 0xff800000;
      auVar377._28_4_ = 0xff800000;
      auVar201 = vblendvps_avx(auVar55,auVar377,auVar29);
      auVar390._8_4_ = 0x7f800000;
      auVar390._0_8_ = 0x7f8000007f800000;
      auVar390._12_4_ = 0x7f800000;
      auVar390._16_4_ = 0x7f800000;
      auVar390._20_4_ = 0x7f800000;
      auVar390._24_4_ = 0x7f800000;
      auVar390._28_4_ = 0x7f800000;
      auVar115 = vblendvps_avx(auVar55,auVar390,auVar115);
      auVar29 = vmaxps_avx(auVar32,auVar201);
      auVar18 = vminps_avx(auVar296,auVar115);
      auVar115 = ZEXT832(0) << 0x20;
      auVar201 = vsubps_avx(auVar115,auVar24);
      auVar24 = vsubps_avx(auVar115,local_8a0);
      auVar56._4_4_ = auVar24._4_4_ * -fVar361;
      auVar56._0_4_ = auVar24._0_4_ * -fVar356;
      auVar56._8_4_ = auVar24._8_4_ * -fVar363;
      auVar56._12_4_ = auVar24._12_4_ * -fVar365;
      auVar56._16_4_ = auVar24._16_4_ * -fVar367;
      auVar56._20_4_ = auVar24._20_4_ * -fVar369;
      auVar56._24_4_ = auVar24._24_4_ * -fVar371;
      auVar56._28_4_ = auVar24._28_4_;
      auVar57._4_4_ = fVar379 * auVar201._4_4_;
      auVar57._0_4_ = fVar373 * auVar201._0_4_;
      auVar57._8_4_ = fVar380 * auVar201._8_4_;
      auVar57._12_4_ = fVar381 * auVar201._12_4_;
      auVar57._16_4_ = fVar382 * auVar201._16_4_;
      auVar57._20_4_ = fVar383 * auVar201._20_4_;
      auVar57._24_4_ = fVar384 * auVar201._24_4_;
      auVar57._28_4_ = auVar201._28_4_;
      auVar201 = vsubps_avx(auVar56,auVar57);
      auVar24 = vsubps_avx(auVar115,local_a20);
      auVar58._4_4_ = fVar305 * auVar24._4_4_;
      auVar58._0_4_ = fVar291 * auVar24._0_4_;
      auVar58._8_4_ = fVar311 * auVar24._8_4_;
      auVar58._12_4_ = fVar317 * auVar24._12_4_;
      auVar58._16_4_ = fVar321 * auVar24._16_4_;
      auVar58._20_4_ = fVar325 * auVar24._20_4_;
      uVar7 = auVar24._28_4_;
      auVar58._24_4_ = fVar329 * auVar24._24_4_;
      auVar58._28_4_ = uVar7;
      auVar24 = vsubps_avx(auVar201,auVar58);
      auVar59._4_4_ = fStack_7bc * -fVar361;
      auVar59._0_4_ = local_7c0 * -fVar356;
      auVar59._8_4_ = fStack_7b8 * -fVar363;
      auVar59._12_4_ = fStack_7b4 * -fVar365;
      auVar59._16_4_ = fStack_7b0 * -fVar367;
      auVar59._20_4_ = fStack_7ac * -fVar369;
      auVar59._24_4_ = fStack_7a8 * -fVar371;
      auVar59._28_4_ = uVar94 ^ 0x80000000;
      auVar386._8_4_ = 0x3f800000;
      auVar386._0_8_ = 0x3f8000003f800000;
      auVar386._12_4_ = 0x3f800000;
      auVar386._16_4_ = 0x3f800000;
      auVar386._20_4_ = 0x3f800000;
      auVar386._24_4_ = 0x3f800000;
      auVar386._28_4_ = 0x3f800000;
      auVar60._4_4_ = fStack_79c * fVar379;
      auVar60._0_4_ = local_7a0 * fVar373;
      auVar60._8_4_ = fStack_798 * fVar380;
      auVar60._12_4_ = fStack_794 * fVar381;
      auVar60._16_4_ = fStack_790 * fVar382;
      auVar60._20_4_ = fStack_78c * fVar383;
      auVar60._24_4_ = fStack_788 * fVar384;
      auVar60._28_4_ = uVar7;
      auVar348 = ZEXT864(0) << 0x20;
      auVar201 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fStack_61c * fVar305;
      auVar61._0_4_ = local_620 * fVar291;
      auVar61._8_4_ = fStack_618 * fVar311;
      auVar61._12_4_ = fStack_614 * fVar317;
      auVar61._16_4_ = fStack_610 * fVar321;
      auVar61._20_4_ = fStack_60c * fVar325;
      auVar61._24_4_ = fStack_608 * fVar329;
      auVar61._28_4_ = uVar7;
      auVar115 = vsubps_avx(auVar201,auVar61);
      auVar201 = vrcpps_avx(auVar115);
      fVar183 = auVar201._0_4_;
      fVar184 = auVar201._4_4_;
      auVar62._4_4_ = auVar115._4_4_ * fVar184;
      auVar62._0_4_ = auVar115._0_4_ * fVar183;
      fVar242 = auVar201._8_4_;
      auVar62._8_4_ = auVar115._8_4_ * fVar242;
      fVar243 = auVar201._12_4_;
      auVar62._12_4_ = auVar115._12_4_ * fVar243;
      fVar258 = auVar201._16_4_;
      auVar62._16_4_ = auVar115._16_4_ * fVar258;
      fVar259 = auVar201._20_4_;
      auVar62._20_4_ = auVar115._20_4_ * fVar259;
      fVar263 = auVar201._24_4_;
      auVar62._24_4_ = auVar115._24_4_ * fVar263;
      auVar62._28_4_ = local_8c0._28_4_;
      auVar30 = vsubps_avx(auVar386,auVar62);
      auVar201 = vandps_avx(auVar297,auVar115);
      auVar116._8_4_ = 0x219392ef;
      auVar116._0_8_ = 0x219392ef219392ef;
      auVar116._12_4_ = 0x219392ef;
      auVar116._16_4_ = 0x219392ef;
      auVar116._20_4_ = 0x219392ef;
      auVar116._24_4_ = 0x219392ef;
      auVar116._28_4_ = 0x219392ef;
      auVar201 = vcmpps_avx(auVar201,auVar116,1);
      auVar63._4_4_ = (fVar184 + fVar184 * auVar30._4_4_) * -auVar24._4_4_;
      auVar63._0_4_ = (fVar183 + fVar183 * auVar30._0_4_) * -auVar24._0_4_;
      auVar63._8_4_ = (fVar242 + fVar242 * auVar30._8_4_) * -auVar24._8_4_;
      auVar63._12_4_ = (fVar243 + fVar243 * auVar30._12_4_) * -auVar24._12_4_;
      auVar63._16_4_ = (fVar258 + fVar258 * auVar30._16_4_) * -auVar24._16_4_;
      auVar63._20_4_ = (fVar259 + fVar259 * auVar30._20_4_) * -auVar24._20_4_;
      auVar63._24_4_ = (fVar263 + fVar263 * auVar30._24_4_) * -auVar24._24_4_;
      auVar63._28_4_ = auVar24._28_4_ ^ 0x80000000;
      auVar24 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,1);
      auVar24 = vorps_avx(auVar201,auVar24);
      auVar24 = vblendvps_avx(auVar63,auVar377,auVar24);
      local_820 = vmaxps_avx(auVar29,auVar24);
      auVar24 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,6);
      auVar24 = vorps_avx(auVar201,auVar24);
      auVar24 = vblendvps_avx(auVar63,auVar390,auVar24);
      auVar113 = vandps_avx(auVar113,local_340);
      local_5c0 = vminps_avx(auVar18,auVar24);
      auVar24 = vcmpps_avx(local_820,local_5c0,2);
      auVar115 = auVar113 & auVar24;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0x7f,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar115 >> 0xbf,0) == '\0') &&
          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar115[0x1f]) goto LAB_008c55e0;
      auVar201 = vminps_avx(_local_ae0,auVar171);
      auVar28 = vminps_avx(local_780,auVar28);
      auVar201 = vminps_avx(auVar201,auVar28);
      auVar27 = vsubps_avx(auVar201,auVar27);
      auVar113 = vandps_avx(auVar24,auVar113);
      auVar82._4_4_ = fStack_37c;
      auVar82._0_4_ = local_380;
      auVar82._8_4_ = fStack_378;
      auVar82._12_4_ = fStack_374;
      auVar82._16_4_ = fStack_370;
      auVar82._20_4_ = fStack_36c;
      auVar82._24_4_ = fStack_368;
      auVar82._28_4_ = fStack_364;
      auVar201 = vminps_avx(auVar82,auVar386);
      auVar279 = ZEXT864(0) << 0x20;
      auVar201 = vmaxps_avx(auVar201,ZEXT832(0) << 0x20);
      fVar183 = DAT_01f7b060._28_4_;
      local_1a0[0] = fVar159 + fVar132 * (auVar201._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1a0[1] = fVar180 + fVar154 * (auVar201._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1a0[2] = fVar181 + fVar155 * (auVar201._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1a0[3] = fVar182 + fVar157 * (auVar201._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_190 = fVar159 + fVar132 * (auVar201._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_18c = fVar180 + fVar154 * (auVar201._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_188 = fVar181 + fVar155 * (auVar201._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_184 = fVar182 + auVar201._28_4_ + fVar183;
      auVar83._4_4_ = fStack_35c;
      auVar83._0_4_ = local_360;
      auVar83._8_4_ = fStack_358;
      auVar83._12_4_ = fStack_354;
      auVar83._16_4_ = fStack_350;
      auVar83._20_4_ = fStack_34c;
      auVar83._24_4_ = fStack_348;
      auVar83._28_4_ = fStack_344;
      auVar201 = vminps_avx(auVar83,auVar386);
      auVar201 = vmaxps_avx(auVar201,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar159 + fVar132 * (auVar201._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1c0[1] = fVar180 + fVar154 * (auVar201._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1c0[2] = fVar181 + fVar155 * (auVar201._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1c0[3] = fVar182 + fVar157 * (auVar201._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_1b0 = fVar159 + fVar132 * (auVar201._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_1ac = fVar180 + fVar154 * (auVar201._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_1a8 = fVar181 + fVar155 * (auVar201._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_1a4 = fVar182 + auVar201._28_4_ + fVar183;
      auVar64._4_4_ = auVar27._4_4_ * 0.99999976;
      auVar64._0_4_ = auVar27._0_4_ * 0.99999976;
      auVar64._8_4_ = auVar27._8_4_ * 0.99999976;
      auVar64._12_4_ = auVar27._12_4_ * 0.99999976;
      auVar64._16_4_ = auVar27._16_4_ * 0.99999976;
      auVar64._20_4_ = auVar27._20_4_ * 0.99999976;
      auVar64._24_4_ = auVar27._24_4_ * 0.99999976;
      auVar64._28_4_ = 0x3f7ffffc;
      auVar201 = vmaxps_avx(ZEXT832(0) << 0x20,auVar64);
      auVar65._4_4_ = auVar201._4_4_ * auVar201._4_4_;
      auVar65._0_4_ = auVar201._0_4_ * auVar201._0_4_;
      auVar65._8_4_ = auVar201._8_4_ * auVar201._8_4_;
      auVar65._12_4_ = auVar201._12_4_ * auVar201._12_4_;
      auVar65._16_4_ = auVar201._16_4_ * auVar201._16_4_;
      auVar65._20_4_ = auVar201._20_4_ * auVar201._20_4_;
      auVar65._24_4_ = auVar201._24_4_ * auVar201._24_4_;
      auVar65._28_4_ = auVar201._28_4_;
      local_940 = vsubps_avx(auVar31,auVar65);
      auVar66._4_4_ = local_940._4_4_ * fVar339 * 4.0;
      auVar66._0_4_ = local_940._0_4_ * fVar247 * 4.0;
      auVar66._8_4_ = local_940._8_4_ * fVar372 * 4.0;
      auVar66._12_4_ = local_940._12_4_ * fVar124 * 4.0;
      auVar66._16_4_ = local_940._16_4_ * fVar126 * 4.0;
      auVar66._20_4_ = local_940._20_4_ * fVar128 * 4.0;
      auVar66._24_4_ = local_940._24_4_ * fVar130 * 4.0;
      auVar66._28_4_ = auVar201._28_4_;
      auVar24 = vsubps_avx(auVar48,auVar66);
      local_9e0 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,5);
      auVar201 = local_9e0;
      if ((((((((local_9e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9e0 >> 0x7f,0) == '\0') &&
            (local_9e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9e0 >> 0xbf,0) == '\0') &&
          (local_9e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9e0[0x1f]) {
        auVar254 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar230 = ZEXT828(0) << 0x20;
        auVar218 = SUB6428(ZEXT864(0),0) << 0x20;
        _local_aa0 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar338 = ZEXT864(0) << 0x20;
        auVar298._8_4_ = 0x7f800000;
        auVar298._0_8_ = 0x7f8000007f800000;
        auVar298._12_4_ = 0x7f800000;
        auVar298._16_4_ = 0x7f800000;
        auVar298._20_4_ = 0x7f800000;
        auVar298._24_4_ = 0x7f800000;
        auVar298._28_4_ = 0x7f800000;
        auVar345._8_4_ = 0xff800000;
        auVar345._0_8_ = 0xff800000ff800000;
        auVar345._12_4_ = 0xff800000;
        auVar345._16_4_ = 0xff800000;
        auVar345._20_4_ = 0xff800000;
        auVar345._24_4_ = 0xff800000;
        auVar345._28_4_ = 0xff800000;
        local_9e0 = auVar33;
        local_940 = auVar34;
      }
      else {
        auVar28 = vrcpps_avx(local_320);
        fVar247 = auVar28._0_4_;
        fVar184 = auVar28._4_4_;
        auVar67._4_4_ = local_320._4_4_ * fVar184;
        auVar67._0_4_ = local_320._0_4_ * fVar247;
        fVar242 = auVar28._8_4_;
        auVar67._8_4_ = local_320._8_4_ * fVar242;
        fVar243 = auVar28._12_4_;
        auVar67._12_4_ = local_320._12_4_ * fVar243;
        fVar258 = auVar28._16_4_;
        auVar67._16_4_ = local_320._16_4_ * fVar258;
        fVar259 = auVar28._20_4_;
        auVar67._20_4_ = local_320._20_4_ * fVar259;
        fVar263 = auVar28._24_4_;
        auVar67._24_4_ = local_320._24_4_ * fVar263;
        auVar67._28_4_ = auVar27._28_4_;
        auVar115 = vsubps_avx(auVar386,auVar67);
        auVar27 = vsqrtps_avx(auVar24);
        fVar247 = fVar247 + fVar247 * auVar115._0_4_;
        fVar184 = fVar184 + fVar184 * auVar115._4_4_;
        fVar242 = fVar242 + fVar242 * auVar115._8_4_;
        fVar243 = fVar243 + fVar243 * auVar115._12_4_;
        fVar258 = fVar258 + fVar258 * auVar115._16_4_;
        fVar259 = fVar259 + fVar259 * auVar115._20_4_;
        fVar263 = fVar263 + fVar263 * auVar115._24_4_;
        auVar29 = vsubps_avx(local_300,auVar27);
        fVar330 = auVar29._0_4_ * fVar247;
        fVar339 = auVar29._4_4_ * fVar184;
        auVar68._4_4_ = fVar339;
        auVar68._0_4_ = fVar330;
        fVar372 = auVar29._8_4_ * fVar242;
        auVar68._8_4_ = fVar372;
        fVar124 = auVar29._12_4_ * fVar243;
        auVar68._12_4_ = fVar124;
        fVar126 = auVar29._16_4_ * fVar258;
        auVar68._16_4_ = fVar126;
        fVar128 = auVar29._20_4_ * fVar259;
        auVar68._20_4_ = fVar128;
        fVar130 = auVar29._24_4_ * fVar263;
        auVar68._24_4_ = fVar130;
        auVar68._28_4_ = 0x7f800000;
        auVar29 = vsubps_avx(auVar27,local_2e0);
        fVar247 = auVar29._0_4_ * fVar247;
        fVar184 = auVar29._4_4_ * fVar184;
        auVar69._4_4_ = fVar184;
        auVar69._0_4_ = fVar247;
        fVar242 = auVar29._8_4_ * fVar242;
        auVar69._8_4_ = fVar242;
        fVar243 = auVar29._12_4_ * fVar243;
        auVar69._12_4_ = fVar243;
        fVar258 = auVar29._16_4_ * fVar258;
        auVar69._16_4_ = fVar258;
        fVar259 = auVar29._20_4_ * fVar259;
        auVar69._20_4_ = fVar259;
        fVar263 = auVar29._24_4_ * fVar263;
        auVar69._24_4_ = fVar263;
        auVar69._28_4_ = 0x3f800000;
        fVar265 = (fVar330 * local_540 + local_560) * fVar185;
        fVar272 = (fVar339 * fStack_53c + fStack_55c) * fVar286;
        fVar274 = (fVar372 * fStack_538 + fStack_558) * fVar244;
        fVar284 = (fVar124 * fStack_534 + fStack_554) * fVar266;
        fVar285 = (fVar126 * fStack_530 + fStack_550) * fVar280;
        fVar318 = (fVar128 * fStack_52c + fStack_54c) * fVar287;
        fVar322 = (fVar130 * fStack_528 + fStack_548) * fVar326;
        auVar219._0_4_ = local_880 + fVar261 * fVar265;
        auVar219._4_4_ = fStack_87c + fVar241 * fVar272;
        auVar219._8_4_ = fStack_878 + fVar312 * fVar274;
        auVar219._12_4_ = fStack_874 + fVar262 * fVar284;
        auVar219._16_4_ = fStack_870 + fVar271 * fVar285;
        auVar219._20_4_ = fStack_86c + fVar283 * fVar318;
        auVar219._24_4_ = fStack_868 + fVar313 * fVar322;
        auVar219._28_4_ = fStack_864 + auVar29._28_4_;
        auVar70._4_4_ = fStack_61c * fVar339;
        auVar70._0_4_ = local_620 * fVar330;
        auVar70._8_4_ = fStack_618 * fVar372;
        auVar70._12_4_ = fStack_614 * fVar124;
        auVar70._16_4_ = fStack_610 * fVar126;
        auVar70._20_4_ = fStack_60c * fVar128;
        auVar70._24_4_ = fStack_608 * fVar130;
        auVar70._28_4_ = auVar27._28_4_;
        local_8a0 = vsubps_avx(auVar70,auVar219);
        auVar235._0_4_ = fVar288 + fVar255 * fVar265;
        auVar235._4_4_ = fVar302 + fVar158 * fVar272;
        auVar235._8_4_ = fVar308 + fVar300 * fVar274;
        auVar235._12_4_ = fVar314 + fVar245 * fVar284;
        auVar235._16_4_ = fVar319 + fVar268 * fVar285;
        auVar235._20_4_ = fVar323 + fVar281 * fVar318;
        auVar235._24_4_ = fVar327 + fVar301 * fVar322;
        auVar235._28_4_ = fVar331 + auVar27._28_4_;
        auVar84._4_4_ = fStack_79c * fVar339;
        auVar84._0_4_ = local_7a0 * fVar330;
        auVar84._8_4_ = fStack_798 * fVar372;
        auVar84._12_4_ = fStack_794 * fVar124;
        auVar84._16_4_ = fStack_790 * fVar126;
        auVar84._20_4_ = fStack_78c * fVar128;
        auVar84._24_4_ = fStack_788 * fVar130;
        auVar84._28_4_ = fVar183;
        auVar27 = vsubps_avx(auVar84,auVar235);
        _local_aa0 = auVar27._0_28_;
        auVar204._0_4_ = fVar289 + fVar257 * fVar265;
        auVar204._4_4_ = fVar303 + fVar223 * fVar272;
        auVar204._8_4_ = fVar309 + fVar306 * fVar274;
        auVar204._12_4_ = fVar315 + fVar246 * fVar284;
        auVar204._16_4_ = fStack_850 + fVar269 * fVar285;
        auVar204._20_4_ = fStack_84c + fVar282 * fVar318;
        auVar204._24_4_ = fStack_848 + fVar307 * fVar322;
        auVar204._28_4_ = fStack_844 + auVar28._28_4_ + auVar115._28_4_ + fStack_544;
        auVar71._4_4_ = fStack_7bc * fVar339;
        auVar71._0_4_ = local_7c0 * fVar330;
        auVar71._8_4_ = fStack_7b8 * fVar372;
        auVar71._12_4_ = fStack_7b4 * fVar124;
        auVar71._16_4_ = fStack_7b0 * fVar126;
        auVar71._20_4_ = fStack_7ac * fVar128;
        auVar71._24_4_ = fStack_7a8 * fVar130;
        auVar71._28_4_ = auVar235._28_4_;
        auVar27 = vsubps_avx(auVar71,auVar204);
        auVar338 = ZEXT3264(auVar27);
        fVar185 = (fVar247 * local_540 + local_560) * fVar185;
        fVar286 = (fVar184 * fStack_53c + fStack_55c) * fVar286;
        fVar244 = (fVar242 * fStack_538 + fStack_558) * fVar244;
        fVar266 = (fVar243 * fStack_534 + fStack_554) * fVar266;
        fVar280 = (fVar258 * fStack_530 + fStack_550) * fVar280;
        fVar287 = (fVar259 * fStack_52c + fStack_54c) * fVar287;
        fVar326 = (fVar263 * fStack_528 + fStack_548) * fVar326;
        auVar205._0_4_ = local_880 + fVar261 * fVar185;
        auVar205._4_4_ = fStack_87c + fVar241 * fVar286;
        auVar205._8_4_ = fStack_878 + fVar312 * fVar244;
        auVar205._12_4_ = fStack_874 + fVar262 * fVar266;
        auVar205._16_4_ = fStack_870 + fVar271 * fVar280;
        auVar205._20_4_ = fStack_86c + fVar283 * fVar287;
        auVar205._24_4_ = fStack_868 + fVar313 * fVar326;
        auVar205._28_4_ = fStack_864 + auVar204._28_4_ + fStack_544;
        auVar72._4_4_ = fVar184 * fStack_61c;
        auVar72._0_4_ = fVar247 * local_620;
        auVar72._8_4_ = fVar242 * fStack_618;
        auVar72._12_4_ = fVar243 * fStack_614;
        auVar72._16_4_ = fVar258 * fStack_610;
        auVar72._20_4_ = fVar259 * fStack_60c;
        auVar72._24_4_ = fVar263 * fStack_608;
        auVar72._28_4_ = fStack_604;
        auVar27 = vsubps_avx(auVar72,auVar205);
        auVar279 = ZEXT3264(auVar27);
        auVar253._0_4_ = fVar288 + fVar255 * fVar185;
        auVar253._4_4_ = fVar302 + fVar158 * fVar286;
        auVar253._8_4_ = fVar308 + fVar300 * fVar244;
        auVar253._12_4_ = fVar314 + fVar245 * fVar266;
        auVar253._16_4_ = fVar319 + fVar268 * fVar280;
        auVar253._20_4_ = fVar323 + fVar281 * fVar287;
        auVar253._24_4_ = fVar327 + fVar301 * fVar326;
        auVar253._28_4_ = fVar331 + fStack_604;
        auVar73._4_4_ = fStack_79c * fVar184;
        auVar73._0_4_ = local_7a0 * fVar247;
        auVar73._8_4_ = fStack_798 * fVar242;
        auVar73._12_4_ = fStack_794 * fVar243;
        auVar73._16_4_ = fStack_790 * fVar258;
        auVar73._20_4_ = fStack_78c * fVar259;
        auVar73._24_4_ = fStack_788 * fVar263;
        auVar73._28_4_ = fStack_784;
        auVar27 = vsubps_avx(auVar73,auVar253);
        auVar254 = ZEXT3264(auVar27);
        auVar236._0_4_ = fVar289 + fVar257 * fVar185;
        auVar236._4_4_ = fVar303 + fVar223 * fVar286;
        auVar236._8_4_ = fVar309 + fVar306 * fVar244;
        auVar236._12_4_ = fVar315 + fVar246 * fVar266;
        auVar236._16_4_ = fStack_850 + fVar269 * fVar280;
        auVar236._20_4_ = fStack_84c + fVar282 * fVar287;
        auVar236._24_4_ = fStack_848 + fVar307 * fVar326;
        auVar236._28_4_ = fStack_844 + auVar235._28_4_;
        auVar74._4_4_ = fStack_7bc * fVar184;
        auVar74._0_4_ = local_7c0 * fVar247;
        auVar74._8_4_ = fStack_7b8 * fVar242;
        auVar74._12_4_ = fStack_7b4 * fVar243;
        auVar74._16_4_ = fStack_7b0 * fVar258;
        auVar74._20_4_ = fStack_7ac * fVar259;
        auVar74._24_4_ = fStack_7a8 * fVar263;
        auVar74._28_4_ = fStack_784;
        auVar27 = vsubps_avx(auVar74,auVar236);
        auVar230 = auVar27._0_28_;
        auVar27 = vcmpps_avx(auVar24,_DAT_01f7b000,5);
        auVar299._8_4_ = 0x7f800000;
        auVar299._0_8_ = 0x7f8000007f800000;
        auVar299._12_4_ = 0x7f800000;
        auVar299._16_4_ = 0x7f800000;
        auVar299._20_4_ = 0x7f800000;
        auVar299._24_4_ = 0x7f800000;
        auVar299._28_4_ = 0x7f800000;
        auVar298 = vblendvps_avx(auVar299,auVar68,auVar27);
        auVar24 = vmaxps_avx(local_500,local_3a0);
        auVar75._4_4_ = auVar24._4_4_ * 1.9073486e-06;
        auVar75._0_4_ = auVar24._0_4_ * 1.9073486e-06;
        auVar75._8_4_ = auVar24._8_4_ * 1.9073486e-06;
        auVar75._12_4_ = auVar24._12_4_ * 1.9073486e-06;
        auVar75._16_4_ = auVar24._16_4_ * 1.9073486e-06;
        auVar75._20_4_ = auVar24._20_4_ * 1.9073486e-06;
        auVar75._24_4_ = auVar24._24_4_ * 1.9073486e-06;
        auVar75._28_4_ = auVar24._28_4_;
        auVar24 = vcmpps_avx(_local_a40,auVar75,1);
        auVar346._8_4_ = 0xff800000;
        auVar346._0_8_ = 0xff800000ff800000;
        auVar346._12_4_ = 0xff800000;
        auVar346._16_4_ = 0xff800000;
        auVar346._20_4_ = 0xff800000;
        auVar346._24_4_ = 0xff800000;
        auVar346._28_4_ = 0xff800000;
        auVar345 = vblendvps_avx(auVar346,auVar69,auVar27);
        auVar28 = auVar27 & auVar24;
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0x7f,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar28 >> 0xbf,0) != '\0') ||
            (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar28[0x1f] < '\0') {
          auVar201 = vandps_avx(auVar24,auVar27);
          auVar193 = vpackssdw_avx(auVar201._0_16_,auVar201._16_16_);
          auVar28 = vcmpps_avx(local_940,ZEXT832(0) << 0x20,2);
          auVar153._8_4_ = 0xff800000;
          auVar153._0_8_ = 0xff800000ff800000;
          auVar153._12_4_ = 0xff800000;
          auVar153._16_4_ = 0xff800000;
          auVar153._20_4_ = 0xff800000;
          auVar153._24_4_ = 0xff800000;
          auVar153._28_4_ = 0xff800000;
          auVar206._8_4_ = 0x7f800000;
          auVar206._0_8_ = 0x7f8000007f800000;
          auVar206._12_4_ = 0x7f800000;
          auVar206._16_4_ = 0x7f800000;
          auVar206._20_4_ = 0x7f800000;
          auVar206._24_4_ = 0x7f800000;
          auVar206._28_4_ = 0x7f800000;
          auVar24 = vblendvps_avx(auVar206,auVar153,auVar28);
          auVar20 = vpmovsxwd_avx(auVar193);
          auVar193 = vpunpckhwd_avx(auVar193,auVar193);
          auVar387._16_16_ = auVar193;
          auVar387._0_16_ = auVar20;
          auVar298 = vblendvps_avx(auVar298,auVar24,auVar387);
          auVar24 = vblendvps_avx(auVar153,auVar206,auVar28);
          auVar345 = vblendvps_avx(auVar345,auVar24,auVar387);
          auVar179._0_8_ = auVar201._0_8_ ^ 0xffffffffffffffff;
          auVar179._8_4_ = auVar201._8_4_ ^ 0xffffffff;
          auVar179._12_4_ = auVar201._12_4_ ^ 0xffffffff;
          auVar179._16_4_ = auVar201._16_4_ ^ 0xffffffff;
          auVar179._20_4_ = auVar201._20_4_ ^ 0xffffffff;
          auVar179._24_4_ = auVar201._24_4_ ^ 0xffffffff;
          auVar179._28_4_ = auVar201._28_4_ ^ 0xffffffff;
          auVar201 = vorps_avx(auVar28,auVar179);
          auVar201 = vandps_avx(auVar27,auVar201);
        }
        auVar218 = local_8a0._0_28_;
      }
      fVar247 = (ray->dir).field_0.m128[0];
      auVar378 = ZEXT3264(CONCAT428(fVar247,CONCAT424(fVar247,CONCAT420(fVar247,CONCAT416(fVar247,
                                                  CONCAT412(fVar247,CONCAT48(fVar247,CONCAT44(
                                                  fVar247,fVar247))))))));
      fVar255 = (ray->dir).field_0.m128[1];
      fVar257 = (ray->dir).field_0.m128[2];
      auVar359 = ZEXT3264(CONCAT428(fVar257,CONCAT424(fVar257,CONCAT420(fVar257,CONCAT416(fVar257,
                                                  CONCAT412(fVar257,CONCAT48(fVar257,CONCAT44(
                                                  fVar257,fVar257))))))));
      local_5a0 = local_820;
      local_580 = vminps_avx(local_5c0,auVar298);
      local_7e0 = vmaxps_avx(local_820,auVar345);
      auVar348 = ZEXT3264(local_7e0);
      _local_5e0 = local_7e0;
      auVar27 = vcmpps_avx(local_820,local_580,2);
      local_700 = vandps_avx(auVar27,auVar113);
      auVar27 = vcmpps_avx(local_7e0,local_5c0,2);
      _local_960 = vandps_avx(auVar27,auVar113);
      auVar240 = ZEXT3264(_local_960);
      auVar27 = vorps_avx(local_700,_local_960);
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        fVar261 = auVar113._28_4_;
        auVar118._0_4_ =
             fVar247 * auVar279._0_4_ + fVar255 * auVar254._0_4_ + fVar257 * auVar230._0_4_;
        auVar118._4_4_ =
             fVar247 * auVar279._4_4_ + fVar255 * auVar254._4_4_ + fVar257 * auVar230._4_4_;
        auVar118._8_4_ =
             fVar247 * auVar279._8_4_ + fVar255 * auVar254._8_4_ + fVar257 * auVar230._8_4_;
        auVar118._12_4_ =
             fVar247 * auVar279._12_4_ + fVar255 * auVar254._12_4_ + fVar257 * auVar230._12_4_;
        auVar118._16_4_ =
             fVar247 * auVar279._16_4_ + fVar255 * auVar254._16_4_ + fVar257 * auVar230._16_4_;
        auVar118._20_4_ =
             fVar247 * auVar279._20_4_ + fVar255 * auVar254._20_4_ + fVar257 * auVar230._20_4_;
        auVar118._24_4_ =
             fVar247 * auVar279._24_4_ + fVar255 * auVar254._24_4_ + fVar257 * auVar230._24_4_;
        auVar118._28_4_ = fVar261 + fVar261 + auVar27._28_4_;
        auVar173._0_8_ = auVar201._0_8_ ^ 0xffffffffffffffff;
        auVar173._8_4_ = auVar201._8_4_ ^ 0xffffffff;
        auVar173._12_4_ = auVar201._12_4_ ^ 0xffffffff;
        auVar173._16_4_ = auVar201._16_4_ ^ 0xffffffff;
        auVar173._20_4_ = auVar201._20_4_ ^ 0xffffffff;
        auVar173._24_4_ = auVar201._24_4_ ^ 0xffffffff;
        auVar173._28_4_ = auVar201._28_4_ ^ 0xffffffff;
        auVar220._8_4_ = 0x7fffffff;
        auVar220._0_8_ = 0x7fffffff7fffffff;
        auVar220._12_4_ = 0x7fffffff;
        auVar220._16_4_ = 0x7fffffff;
        auVar220._20_4_ = 0x7fffffff;
        auVar220._24_4_ = 0x7fffffff;
        auVar220._28_4_ = 0x7fffffff;
        auVar113 = vandps_avx(auVar118,auVar220);
        auVar237._8_4_ = 0x3e99999a;
        auVar237._0_8_ = 0x3e99999a3e99999a;
        auVar237._12_4_ = 0x3e99999a;
        auVar237._16_4_ = 0x3e99999a;
        auVar237._20_4_ = 0x3e99999a;
        auVar237._24_4_ = 0x3e99999a;
        auVar237._28_4_ = 0x3e99999a;
        auVar113 = vcmpps_avx(auVar113,auVar237,1);
        local_660 = vorps_avx(auVar113,auVar173);
        auVar119._0_4_ =
             fVar247 * auVar218._0_4_ + fVar255 * (float)local_aa0._0_4_ + auVar338._0_4_ * fVar257;
        auVar119._4_4_ =
             fVar247 * auVar218._4_4_ + fVar255 * (float)local_aa0._4_4_ + auVar338._4_4_ * fVar257;
        auVar119._8_4_ = fVar247 * auVar218._8_4_ + fVar255 * fStack_a98 + auVar338._8_4_ * fVar257;
        auVar119._12_4_ =
             fVar247 * auVar218._12_4_ + fVar255 * fStack_a94 + auVar338._12_4_ * fVar257;
        auVar119._16_4_ =
             fVar247 * auVar218._16_4_ + fVar255 * fStack_a90 + auVar338._16_4_ * fVar257;
        auVar119._20_4_ =
             fVar247 * auVar218._20_4_ + fVar255 * fStack_a8c + auVar338._20_4_ * fVar257;
        auVar119._24_4_ =
             fVar247 * auVar218._24_4_ + fVar255 * fStack_a88 + auVar338._24_4_ * fVar257;
        auVar119._28_4_ = fVar261 + auVar254._28_4_ + local_660._28_4_;
        auVar113 = vandps_avx(auVar119,auVar220);
        auVar113 = vcmpps_avx(auVar113,auVar237,1);
        auVar113 = vorps_avx(auVar113,auVar173);
        auVar147._8_4_ = 3;
        auVar147._0_8_ = 0x300000003;
        auVar147._12_4_ = 3;
        auVar147._16_4_ = 3;
        auVar147._20_4_ = 3;
        auVar147._24_4_ = 3;
        auVar147._28_4_ = 3;
        auVar174._8_4_ = 2;
        auVar174._0_8_ = 0x200000002;
        auVar174._12_4_ = 2;
        auVar174._16_4_ = 2;
        auVar174._20_4_ = 2;
        auVar174._24_4_ = 2;
        auVar174._28_4_ = 2;
        auVar113 = vblendvps_avx(auVar174,auVar147,auVar113);
        local_680 = ZEXT432(local_b24);
        local_6a0 = vpshufd_avx(ZEXT416(local_b24),0);
        auVar193 = vpcmpgtd_avx(auVar113._16_16_,local_6a0);
        auStack_690 = auVar26._16_16_;
        auVar20 = vpcmpgtd_avx(auVar113._0_16_,local_6a0);
        auVar148._16_16_ = auVar193;
        auVar148._0_16_ = auVar20;
        local_640 = vblendps_avx(ZEXT1632(auVar20),auVar148,0xf0);
        auVar113 = vandnps_avx(local_640,local_700);
        local_800._4_4_ = local_820._4_4_ + (float)local_6e0._4_4_;
        local_800._0_4_ = local_820._0_4_ + (float)local_6e0._0_4_;
        fStack_7f8 = local_820._8_4_ + fStack_6d8;
        fStack_7f4 = local_820._12_4_ + fStack_6d4;
        fStack_7f0 = local_820._16_4_ + fStack_6d0;
        fStack_7ec = local_820._20_4_ + fStack_6cc;
        fStack_7e8 = local_820._24_4_ + fStack_6c8;
        fStack_7e4 = local_820._28_4_ + fStack_6c4;
        while( true ) {
          local_3c0 = auVar113;
          local_ac0 = auVar22._0_4_;
          fStack_abc = auVar22._4_4_;
          fStack_ab8 = auVar22._8_4_;
          fStack_ab4 = auVar22._12_4_;
          local_ab0 = auVar17._0_4_;
          fStack_aac = auVar17._4_4_;
          fStack_aa8 = auVar17._8_4_;
          fStack_aa4 = auVar17._12_4_;
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0xbf,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar113[0x1f]) break;
          auVar149._8_4_ = 0x7f800000;
          auVar149._0_8_ = 0x7f8000007f800000;
          auVar149._12_4_ = 0x7f800000;
          auVar149._16_4_ = 0x7f800000;
          auVar149._20_4_ = 0x7f800000;
          auVar149._24_4_ = 0x7f800000;
          auVar149._28_4_ = 0x7f800000;
          auVar201 = vblendvps_avx(auVar149,local_820,auVar113);
          auVar27 = vshufps_avx(auVar201,auVar201,0xb1);
          auVar27 = vminps_avx(auVar201,auVar27);
          auVar24 = vshufpd_avx(auVar27,auVar27,5);
          auVar27 = vminps_avx(auVar27,auVar24);
          auVar24 = vperm2f128_avx(auVar27,auVar27,1);
          auVar27 = vminps_avx(auVar27,auVar24);
          auVar201 = vcmpps_avx(auVar201,auVar27,0);
          auVar27 = auVar113 & auVar201;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar113 = vandps_avx(auVar201,auVar113);
          }
          uVar86 = vmovmskps_avx(auVar113);
          uVar94 = 0;
          if (uVar86 != 0) {
            for (; (uVar86 >> uVar94 & 1) == 0; uVar94 = uVar94 + 1) {
            }
          }
          uVar88 = (ulong)uVar94;
          *(undefined4 *)(local_3c0 + uVar88 * 4) = 0;
          aVar8 = (ray->dir).field_0.field_1;
          local_860 = aVar8.x;
          fStack_85c = aVar8.y;
          fStack_858 = aVar8.z;
          aStack_854 = aVar8.field_3;
          auVar193 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
          fVar247 = local_1a0[uVar88];
          uVar94 = *(uint *)(local_5a0 + uVar88 * 4);
          if (auVar193._0_4_ < 0.0) {
            auVar359 = ZEXT1664(auVar359._0_16_);
            auVar378 = ZEXT1664(auVar378._0_16_);
            fVar255 = sqrtf(auVar193._0_4_);
            uVar88 = extraout_RAX;
          }
          else {
            auVar193 = vsqrtss_avx(auVar193,auVar193);
            fVar255 = auVar193._0_4_;
          }
          auVar279 = ZEXT464(uVar94);
          auVar20 = vminps_avx(auVar17,_local_9a0);
          auVar193 = vmaxps_avx(auVar17,_local_9a0);
          auVar21 = vminps_avx(auVar22,_local_9b0);
          auVar102 = vminps_avx(auVar20,auVar21);
          auVar20 = vmaxps_avx(auVar22,_local_9b0);
          auVar21 = vmaxps_avx(auVar193,auVar20);
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar193 = vandps_avx(auVar102,auVar190);
          auVar20 = vandps_avx(auVar21,auVar190);
          auVar193 = vmaxps_avx(auVar193,auVar20);
          auVar20 = vmovshdup_avx(auVar193);
          auVar20 = vmaxss_avx(auVar20,auVar193);
          auVar193 = vshufpd_avx(auVar193,auVar193,1);
          auVar193 = vmaxss_avx(auVar193,auVar20);
          local_880 = auVar193._0_4_ * 1.9073486e-06;
          local_940._0_4_ = fVar255 * 1.9073486e-06;
          local_780._0_16_ = vshufps_avx(auVar21,auVar21,0xff);
          auVar193 = vinsertps_avx(ZEXT416(uVar94),ZEXT416((uint)fVar247),0x10);
          auVar338 = ZEXT1664(auVar193);
          uVar90 = 0;
          while( true ) {
            auVar193 = auVar338._0_16_;
            bVar85 = (byte)uVar88;
            if (uVar90 == 5) break;
            auVar21 = vmovshdup_avx(auVar193);
            fVar247 = auVar21._0_4_;
            fVar185 = 1.0 - fVar247;
            fVar255 = fVar185 * fVar185;
            fVar257 = fVar185 * fVar255;
            fVar261 = fVar247 * fVar247;
            fVar183 = fVar247 * fVar261;
            fVar184 = fVar247 * fVar185;
            auVar20 = vshufps_avx(ZEXT416((uint)(fVar183 * 0.16666667)),
                                  ZEXT416((uint)(fVar183 * 0.16666667)),0);
            auVar102 = ZEXT416((uint)((fVar183 * 4.0 + fVar257 +
                                      fVar247 * fVar184 * 12.0 + fVar185 * fVar184 * 6.0) *
                                     0.16666667));
            auVar102 = vshufps_avx(auVar102,auVar102,0);
            auVar109 = ZEXT416((uint)((fVar257 * 4.0 + fVar183 +
                                      fVar185 * fVar184 * 12.0 + fVar247 * fVar184 * 6.0) *
                                     0.16666667));
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            auVar101 = vshufps_avx(auVar193,auVar193,0);
            auVar165._0_4_ = auVar101._0_4_ * local_860 + 0.0;
            auVar165._4_4_ = auVar101._4_4_ * fStack_85c + 0.0;
            auVar165._8_4_ = auVar101._8_4_ * fStack_858 + 0.0;
            auVar165._12_4_ = auVar101._12_4_ * aStack_854.w + 0.0;
            auVar101 = vshufps_avx(ZEXT416((uint)(fVar257 * 0.16666667)),
                                   ZEXT416((uint)(fVar257 * 0.16666667)),0);
            auVar100._0_4_ =
                 auVar101._0_4_ * local_ab0 +
                 auVar109._0_4_ * (float)local_9a0._0_4_ +
                 auVar20._0_4_ * (float)local_9b0._0_4_ + auVar102._0_4_ * local_ac0;
            auVar100._4_4_ =
                 auVar101._4_4_ * fStack_aac +
                 auVar109._4_4_ * (float)local_9a0._4_4_ +
                 auVar20._4_4_ * (float)local_9b0._4_4_ + auVar102._4_4_ * fStack_abc;
            auVar100._8_4_ =
                 auVar101._8_4_ * fStack_aa8 +
                 auVar109._8_4_ * fStack_998 +
                 auVar20._8_4_ * fStack_9a8 + auVar102._8_4_ * fStack_ab8;
            auVar100._12_4_ =
                 auVar101._12_4_ * fStack_aa4 +
                 auVar109._12_4_ * fStack_994 +
                 auVar20._12_4_ * fStack_9a4 + auVar102._12_4_ * fStack_ab4;
            local_8a0._0_16_ = auVar100;
            auVar20 = vsubps_avx(auVar165,auVar100);
            _local_a40 = auVar20;
            auVar20 = vdpps_avx(auVar20,auVar20,0x7f);
            fVar257 = auVar20._0_4_;
            if (fVar257 < 0.0) {
              local_9e0._0_16_ = auVar21;
              local_a00._0_4_ = fVar261;
              local_a20._0_4_ = fVar255;
              local_8c0._0_4_ = fVar184;
              fVar183 = sqrtf(fVar257);
              uVar88 = extraout_RAX_00;
              fVar261 = (float)local_a00._0_4_;
              fVar184 = (float)local_8c0._0_4_;
              fVar255 = (float)local_a20._0_4_;
              fVar247 = (float)local_9e0._0_4_;
            }
            else {
              auVar21 = vsqrtss_avx(auVar20,auVar20);
              fVar183 = auVar21._0_4_;
            }
            auVar21 = vshufps_avx(ZEXT416((uint)(fVar261 * 0.5)),ZEXT416((uint)(fVar261 * 0.5)),0);
            auVar102 = ZEXT416((uint)((fVar255 + fVar184 * 4.0) * 0.5));
            auVar102 = vshufps_avx(auVar102,auVar102,0);
            auVar109 = ZEXT416((uint)((fVar247 * -fVar247 - fVar184 * 4.0) * 0.5));
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            auVar101 = ZEXT416((uint)(fVar185 * -fVar185 * 0.5));
            auVar101 = vshufps_avx(auVar101,auVar101,0);
            auVar294._0_4_ =
                 local_ab0 * auVar101._0_4_ +
                 (float)local_9a0._0_4_ * auVar109._0_4_ +
                 (float)local_9b0._0_4_ * auVar21._0_4_ + local_ac0 * auVar102._0_4_;
            auVar294._4_4_ =
                 fStack_aac * auVar101._4_4_ +
                 (float)local_9a0._4_4_ * auVar109._4_4_ +
                 (float)local_9b0._4_4_ * auVar21._4_4_ + fStack_abc * auVar102._4_4_;
            auVar294._8_4_ =
                 fStack_aa8 * auVar101._8_4_ +
                 fStack_998 * auVar109._8_4_ +
                 fStack_9a8 * auVar21._8_4_ + fStack_ab8 * auVar102._8_4_;
            auVar294._12_4_ =
                 fStack_aa4 * auVar101._12_4_ +
                 fStack_994 * auVar109._12_4_ +
                 fStack_9a4 * auVar21._12_4_ + fStack_ab4 * auVar102._12_4_;
            auVar21 = vshufps_avx(auVar193,auVar193,0x55);
            auVar102 = ZEXT416((uint)(fVar185 - (fVar247 + fVar247)));
            auVar109 = vshufps_avx(auVar102,auVar102,0);
            auVar102 = ZEXT416((uint)(fVar247 - (fVar185 + fVar185)));
            auVar101 = vshufps_avx(auVar102,auVar102,0);
            auVar108 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
            auVar102 = vdpps_avx(auVar294,auVar294,0x7f);
            auVar137._0_4_ =
                 local_ab0 * auVar108._0_4_ +
                 (float)local_9a0._0_4_ * auVar101._0_4_ +
                 (float)local_9b0._0_4_ * auVar21._0_4_ + local_ac0 * auVar109._0_4_;
            auVar137._4_4_ =
                 fStack_aac * auVar108._4_4_ +
                 (float)local_9a0._4_4_ * auVar101._4_4_ +
                 (float)local_9b0._4_4_ * auVar21._4_4_ + fStack_abc * auVar109._4_4_;
            auVar137._8_4_ =
                 fStack_aa8 * auVar108._8_4_ +
                 fStack_998 * auVar101._8_4_ +
                 fStack_9a8 * auVar21._8_4_ + fStack_ab8 * auVar109._8_4_;
            auVar137._12_4_ =
                 fStack_aa4 * auVar108._12_4_ +
                 fStack_994 * auVar101._12_4_ +
                 fStack_9a4 * auVar21._12_4_ + fStack_ab4 * auVar109._12_4_;
            auVar21 = vblendps_avx(auVar102,_DAT_01f45a50,0xe);
            auVar109 = vrsqrtss_avx(auVar21,auVar21);
            fVar255 = auVar109._0_4_;
            fVar247 = auVar102._0_4_;
            auVar109 = vdpps_avx(auVar294,auVar137,0x7f);
            auVar101 = vshufps_avx(auVar102,auVar102,0);
            auVar138._0_4_ = auVar137._0_4_ * auVar101._0_4_;
            auVar138._4_4_ = auVar137._4_4_ * auVar101._4_4_;
            auVar138._8_4_ = auVar137._8_4_ * auVar101._8_4_;
            auVar138._12_4_ = auVar137._12_4_ * auVar101._12_4_;
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            auVar210._0_4_ = auVar294._0_4_ * auVar109._0_4_;
            auVar210._4_4_ = auVar294._4_4_ * auVar109._4_4_;
            auVar210._8_4_ = auVar294._8_4_ * auVar109._8_4_;
            auVar210._12_4_ = auVar294._12_4_ * auVar109._12_4_;
            auVar108 = vsubps_avx(auVar138,auVar210);
            auVar109 = vrcpss_avx(auVar21,auVar21);
            auVar21 = vmaxss_avx(ZEXT416((uint)local_880),
                                 ZEXT416((uint)(auVar338._0_4_ * (float)local_940._0_4_)));
            auVar109 = ZEXT416((uint)(auVar109._0_4_ * (2.0 - fVar247 * auVar109._0_4_)));
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            uVar76 = CONCAT44(auVar294._4_4_,auVar294._0_4_);
            auVar227._0_8_ = uVar76 ^ 0x8000000080000000;
            auVar227._8_4_ = -auVar294._8_4_;
            auVar227._12_4_ = -auVar294._12_4_;
            auVar101 = ZEXT416((uint)(fVar255 * 1.5 + fVar247 * -0.5 * fVar255 * fVar255 * fVar255))
            ;
            auVar101 = vshufps_avx(auVar101,auVar101,0);
            auVar191._0_4_ = auVar101._0_4_ * auVar108._0_4_ * auVar109._0_4_;
            auVar191._4_4_ = auVar101._4_4_ * auVar108._4_4_ * auVar109._4_4_;
            auVar191._8_4_ = auVar101._8_4_ * auVar108._8_4_ * auVar109._8_4_;
            auVar191._12_4_ = auVar101._12_4_ * auVar108._12_4_ * auVar109._12_4_;
            auVar252._0_4_ = auVar294._0_4_ * auVar101._0_4_;
            auVar252._4_4_ = auVar294._4_4_ * auVar101._4_4_;
            auVar252._8_4_ = auVar294._8_4_ * auVar101._8_4_;
            auVar252._12_4_ = auVar294._12_4_ * auVar101._12_4_;
            local_9e0._0_4_ = auVar21._0_4_;
            if (fVar247 < 0.0) {
              local_a00._0_4_ = fVar183;
              local_a20._0_16_ = auVar227;
              local_8c0._0_16_ = auVar252;
              local_8e0._0_16_ = auVar191;
              fVar255 = sqrtf(fVar247);
              uVar88 = extraout_RAX_01;
              auVar191 = local_8e0._0_16_;
              auVar227 = local_a20._0_16_;
              auVar252 = local_8c0._0_16_;
              fVar183 = (float)local_a00._0_4_;
              fVar247 = (float)local_9e0._0_4_;
            }
            else {
              auVar102 = vsqrtss_avx(auVar102,auVar102);
              fVar255 = auVar102._0_4_;
              fVar247 = auVar21._0_4_;
            }
            auVar21 = vdpps_avx(_local_a40,auVar252,0x7f);
            fVar255 = (local_880 / fVar255) * (fVar183 + 1.0) + fVar247 + fVar183 * local_880;
            auVar102 = vdpps_avx(auVar227,auVar252,0x7f);
            auVar109 = vdpps_avx(_local_a40,auVar191,0x7f);
            auVar79._4_4_ = fStack_85c;
            auVar79._0_4_ = local_860;
            auVar79._8_4_ = fStack_858;
            auVar79._12_4_ = aStack_854.a;
            auVar101 = vdpps_avx(auVar79,auVar252,0x7f);
            auVar108 = vdpps_avx(_local_a40,auVar227,0x7f);
            fVar261 = auVar102._0_4_ + auVar109._0_4_;
            fVar183 = auVar21._0_4_;
            auVar103._0_4_ = fVar183 * fVar183;
            auVar103._4_4_ = auVar21._4_4_ * auVar21._4_4_;
            auVar103._8_4_ = auVar21._8_4_ * auVar21._8_4_;
            auVar103._12_4_ = auVar21._12_4_ * auVar21._12_4_;
            auVar109 = vsubps_avx(auVar20,auVar103);
            auVar102 = vdpps_avx(_local_a40,auVar79,0x7f);
            fVar184 = auVar108._0_4_ - fVar183 * fVar261;
            fVar185 = auVar102._0_4_ - fVar183 * auVar101._0_4_;
            auVar102 = vrsqrtss_avx(auVar109,auVar109);
            fVar158 = auVar109._0_4_;
            fVar183 = auVar102._0_4_;
            fVar183 = fVar183 * 1.5 + fVar158 * -0.5 * fVar183 * fVar183 * fVar183;
            if (fVar158 < 0.0) {
              local_a00._0_16_ = auVar21;
              local_a20._0_4_ = fVar255;
              local_8c0._0_16_ = auVar101;
              local_8e0._0_16_ = ZEXT416((uint)fVar261);
              local_720._0_4_ = fVar184;
              local_740._0_4_ = fVar185;
              local_760._0_4_ = fVar183;
              fVar158 = sqrtf(fVar158);
              uVar88 = extraout_RAX_02;
              fVar183 = (float)local_760._0_4_;
              fVar184 = (float)local_720._0_4_;
              fVar185 = (float)local_740._0_4_;
              auVar101 = local_8c0._0_16_;
              fVar255 = (float)local_a20._0_4_;
              auVar21 = local_a00._0_16_;
              fVar247 = (float)local_9e0._0_4_;
              auVar102 = local_8e0._0_16_;
            }
            else {
              auVar102 = vsqrtss_avx(auVar109,auVar109);
              fVar158 = auVar102._0_4_;
              auVar102 = ZEXT416((uint)fVar261);
            }
            auVar378 = ZEXT1664(auVar21);
            auVar359 = ZEXT464((uint)fVar255);
            auVar279 = ZEXT1664(auVar20);
            auVar108 = vpermilps_avx(local_8a0._0_16_,0xff);
            auVar142 = vshufps_avx(auVar294,auVar294,0xff);
            fVar261 = fVar184 * fVar183 - auVar142._0_4_;
            auVar211._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
            auVar211._8_4_ = auVar101._8_4_ ^ 0x80000000;
            auVar211._12_4_ = auVar101._12_4_ ^ 0x80000000;
            auVar228._0_4_ = -fVar261;
            auVar228._4_4_ = 0x80000000;
            auVar228._8_4_ = 0x80000000;
            auVar228._12_4_ = 0x80000000;
            auVar109 = vinsertps_avx(auVar228,ZEXT416((uint)(fVar185 * fVar183)),0x1c);
            auVar101 = vmovsldup_avx(ZEXT416((uint)(auVar102._0_4_ * fVar185 * fVar183 -
                                                   auVar101._0_4_ * fVar261)));
            auVar109 = vdivps_avx(auVar109,auVar101);
            auVar102 = vinsertps_avx(auVar102,auVar211,0x10);
            auVar102 = vdivps_avx(auVar102,auVar101);
            auVar101 = vmovsldup_avx(auVar21);
            auVar139 = ZEXT416((uint)(fVar158 - auVar108._0_4_));
            auVar108 = vmovsldup_avx(auVar139);
            auVar166._0_4_ = auVar101._0_4_ * auVar109._0_4_ + auVar108._0_4_ * auVar102._0_4_;
            auVar166._4_4_ = auVar101._4_4_ * auVar109._4_4_ + auVar108._4_4_ * auVar102._4_4_;
            auVar166._8_4_ = auVar101._8_4_ * auVar109._8_4_ + auVar108._8_4_ * auVar102._8_4_;
            auVar166._12_4_ = auVar101._12_4_ * auVar109._12_4_ + auVar108._12_4_ * auVar102._12_4_;
            auVar102 = vsubps_avx(auVar193,auVar166);
            auVar338 = ZEXT1664(auVar102);
            auVar167._8_4_ = 0x7fffffff;
            auVar167._0_8_ = 0x7fffffff7fffffff;
            auVar167._12_4_ = 0x7fffffff;
            auVar193 = vandps_avx(auVar21,auVar167);
            if (auVar193._0_4_ < fVar255) {
              auVar192._8_4_ = 0x7fffffff;
              auVar192._0_8_ = 0x7fffffff7fffffff;
              auVar192._12_4_ = 0x7fffffff;
              auVar193 = vandps_avx(auVar139,auVar192);
              if (auVar193._0_4_ < (float)local_780._0_4_ * 1.9073486e-06 + fVar247 + fVar255) {
                bVar96 = uVar90 < 5;
                fVar247 = auVar102._0_4_ + (float)local_840._0_4_;
                bVar85 = 0;
                if (fVar247 < (ray->org).field_0.m128[3]) goto LAB_008c6299;
                fVar261 = ray->tfar;
                auVar240 = ZEXT3264(_local_960);
                if (fVar261 < fVar247) goto LAB_008c62a2;
                auVar193 = vmovshdup_avx(auVar102);
                bVar85 = 0;
                fVar183 = auVar193._0_4_;
                if (fVar183 < 0.0) goto LAB_008c62a2;
                if (fVar183 <= 1.0) {
                  auVar193 = vrsqrtss_avx(auVar20,auVar20);
                  fVar184 = auVar193._0_4_;
                  pGVar12 = (context->scene->geometries).items[uVar91].ptr;
                  if ((pGVar12->mask & ray->mask) == 0) {
                    bVar85 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar85 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar193 = ZEXT416((uint)(fVar184 * 1.5 +
                                             fVar257 * -0.5 * fVar184 * fVar184 * fVar184));
                    auVar193 = vshufps_avx(auVar193,auVar193,0);
                    auVar194._0_4_ = auVar193._0_4_ * (float)local_a40._0_4_;
                    auVar194._4_4_ = auVar193._4_4_ * (float)local_a40._4_4_;
                    auVar194._8_4_ = auVar193._8_4_ * fStack_a38;
                    auVar194._12_4_ = auVar193._12_4_ * fStack_a34;
                    auVar104._0_4_ = auVar294._0_4_ + auVar142._0_4_ * auVar194._0_4_;
                    auVar104._4_4_ = auVar294._4_4_ + auVar142._4_4_ * auVar194._4_4_;
                    auVar104._8_4_ = auVar294._8_4_ + auVar142._8_4_ * auVar194._8_4_;
                    auVar104._12_4_ = auVar294._12_4_ + auVar142._12_4_ * auVar194._12_4_;
                    auVar193 = vshufps_avx(auVar194,auVar194,0xc9);
                    auVar109 = vshufps_avx(auVar294,auVar294,0xc9);
                    auVar195._0_4_ = auVar109._0_4_ * auVar194._0_4_;
                    auVar195._4_4_ = auVar109._4_4_ * auVar194._4_4_;
                    auVar195._8_4_ = auVar109._8_4_ * auVar194._8_4_;
                    auVar195._12_4_ = auVar109._12_4_ * auVar194._12_4_;
                    auVar212._0_4_ = auVar294._0_4_ * auVar193._0_4_;
                    auVar212._4_4_ = auVar294._4_4_ * auVar193._4_4_;
                    auVar212._8_4_ = auVar294._8_4_ * auVar193._8_4_;
                    auVar212._12_4_ = auVar294._12_4_ * auVar193._12_4_;
                    auVar101 = vsubps_avx(auVar212,auVar195);
                    auVar193 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar109 = vshufps_avx(auVar104,auVar104,0xc9);
                    auVar213._0_4_ = auVar109._0_4_ * auVar193._0_4_;
                    auVar213._4_4_ = auVar109._4_4_ * auVar193._4_4_;
                    auVar213._8_4_ = auVar109._8_4_ * auVar193._8_4_;
                    auVar213._12_4_ = auVar109._12_4_ * auVar193._12_4_;
                    auVar193 = vshufps_avx(auVar101,auVar101,0xd2);
                    auVar105._0_4_ = auVar104._0_4_ * auVar193._0_4_;
                    auVar105._4_4_ = auVar104._4_4_ * auVar193._4_4_;
                    auVar105._8_4_ = auVar104._8_4_ * auVar193._8_4_;
                    auVar105._12_4_ = auVar104._12_4_ * auVar193._12_4_;
                    auVar109 = vsubps_avx(auVar213,auVar105);
                    auVar193 = vshufps_avx(auVar109,auVar109,0xe9);
                    local_920 = vmovlps_avx(auVar193);
                    local_918 = auVar109._0_4_;
                    local_910 = 0;
                    local_90c = (undefined4)local_8e8;
                    local_904 = context->user->instID[0];
                    local_900 = context->user->instPrimID[0];
                    ray->tfar = fVar247;
                    local_6c0._0_4_ = 0xffffffff;
                    local_990.valid = (int *)local_6c0;
                    local_990.geometryUserPtr = pGVar12->userPtr;
                    local_990.context = context->user;
                    local_990.hit = (RTCHitN *)&local_920;
                    local_990.N = 1;
                    local_990.ray = (RTCRayN *)ray;
                    local_914 = fVar183;
                    local_908 = uVar91;
                    if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_008c64af:
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar279 = ZEXT1664(auVar279._0_16_);
                        auVar338 = ZEXT1664(auVar338._0_16_);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        auVar378 = ZEXT1664(auVar378._0_16_);
                        (*p_Var16)(&local_990);
                        if (*local_990.valid == 0) goto LAB_008c64f7;
                      }
                      bVar85 = 1;
                    }
                    else {
                      auVar279 = ZEXT1664(auVar20);
                      auVar338 = ZEXT1664(auVar102);
                      auVar359 = ZEXT464((uint)fVar255);
                      auVar378 = ZEXT1664(auVar21);
                      (*pGVar12->occlusionFilterN)(&local_990);
                      if (*local_990.valid != 0) goto LAB_008c64af;
LAB_008c64f7:
                      ray->tfar = fVar261;
                      bVar85 = 0;
                    }
                  }
                }
                goto LAB_008c6299;
              }
            }
            uVar90 = uVar90 + 1;
          }
          bVar96 = false;
LAB_008c6299:
          auVar240 = ZEXT3264(_local_960);
LAB_008c62a2:
          fVar247 = ray->tfar;
          auVar120._4_4_ = fVar247;
          auVar120._0_4_ = fVar247;
          auVar120._8_4_ = fVar247;
          auVar120._12_4_ = fVar247;
          auVar120._16_4_ = fVar247;
          auVar120._20_4_ = fVar247;
          auVar120._24_4_ = fVar247;
          auVar120._28_4_ = fVar247;
          bVar95 = bVar95 | bVar96 & bVar85;
          auVar113 = vcmpps_avx(_local_800,auVar120,2);
          auVar113 = vandps_avx(auVar113,local_3c0);
          auVar348 = ZEXT3264(local_7e0);
        }
        auVar150._0_4_ = auVar348._0_4_ + (float)local_6e0._0_4_;
        auVar150._4_4_ = auVar348._4_4_ + (float)local_6e0._4_4_;
        auVar150._8_4_ = auVar348._8_4_ + fStack_6d8;
        auVar150._12_4_ = auVar348._12_4_ + fStack_6d4;
        auVar150._16_4_ = auVar348._16_4_ + fStack_6d0;
        auVar150._20_4_ = auVar348._20_4_ + fStack_6cc;
        auVar150._24_4_ = auVar348._24_4_ + fStack_6c8;
        auVar150._28_4_ = auVar348._28_4_ + fStack_6c4;
        auVar106._0_4_ = ray->tfar;
        auVar106._4_4_ = ray->mask;
        auVar106._8_4_ = ray->id;
        auVar106._12_4_ = ray->flags;
        fVar247 = ray->tfar;
        auVar175._4_4_ = fVar247;
        auVar175._0_4_ = fVar247;
        auVar175._8_4_ = fVar247;
        auVar175._12_4_ = fVar247;
        auVar175._16_4_ = fVar247;
        auVar175._20_4_ = fVar247;
        auVar175._24_4_ = fVar247;
        auVar175._28_4_ = fVar247;
        auVar113 = vcmpps_avx(auVar150,auVar175,2);
        local_7e0 = vandps_avx(auVar113,auVar240._0_32_);
        auVar151._8_4_ = 3;
        auVar151._0_8_ = 0x300000003;
        auVar151._12_4_ = 3;
        auVar151._16_4_ = 3;
        auVar151._20_4_ = 3;
        auVar151._24_4_ = 3;
        auVar151._28_4_ = 3;
        auVar176._8_4_ = 2;
        auVar176._0_8_ = 0x200000002;
        auVar176._12_4_ = 2;
        auVar176._16_4_ = 2;
        auVar176._20_4_ = 2;
        auVar176._24_4_ = 2;
        auVar176._28_4_ = 2;
        auVar113 = vblendvps_avx(auVar176,auVar151,local_660);
        auVar193 = vpcmpgtd_avx(auVar113._16_16_,local_6a0);
        auVar20 = vpshufd_avx(local_680._0_16_,0);
        auVar20 = vpcmpgtd_avx(auVar113._0_16_,auVar20);
        auVar177._16_16_ = auVar193;
        auVar177._0_16_ = auVar106;
        _local_800 = vblendps_avx(ZEXT1632(auVar20),auVar177,0xf0);
        local_6c0 = vandnps_avx(_local_800,local_7e0);
        local_820 = _local_5e0;
        local_960._4_4_ = (float)local_6e0._4_4_ + (float)local_5e0._4_4_;
        local_960._0_4_ = (float)local_6e0._0_4_ + (float)local_5e0._0_4_;
        fStack_958 = fStack_6d8 + fStack_5d8;
        fStack_954 = fStack_6d4 + fStack_5d4;
        fStack_950 = fStack_6d0 + fStack_5d0;
        fStack_94c = fStack_6cc + fStack_5cc;
        fStack_948 = fStack_6c8 + fStack_5c8;
        fStack_944 = fStack_6c4 + fStack_5c4;
        for (; (((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_6c0 >> 0x7f,0) != '\0') ||
                 (local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_6c0 >> 0xbf,0) != '\0') ||
               (local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_6c0[0x1f] < '\0'; local_6c0 = vandps_avx(auVar113,local_6c0)) {
          auVar121._8_4_ = 0x7f800000;
          auVar121._0_8_ = 0x7f8000007f800000;
          auVar121._12_4_ = 0x7f800000;
          auVar121._16_4_ = 0x7f800000;
          auVar121._20_4_ = 0x7f800000;
          auVar121._24_4_ = 0x7f800000;
          auVar121._28_4_ = 0x7f800000;
          auVar113 = vblendvps_avx(auVar121,local_820,local_6c0);
          auVar201 = vshufps_avx(auVar113,auVar113,0xb1);
          auVar201 = vminps_avx(auVar113,auVar201);
          auVar27 = vshufpd_avx(auVar201,auVar201,5);
          auVar201 = vminps_avx(auVar201,auVar27);
          auVar27 = vperm2f128_avx(auVar201,auVar201,1);
          auVar201 = vminps_avx(auVar201,auVar27);
          auVar201 = vcmpps_avx(auVar113,auVar201,0);
          auVar27 = local_6c0 & auVar201;
          auVar113 = local_6c0;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            auVar113 = vandps_avx(auVar201,local_6c0);
          }
          uVar86 = vmovmskps_avx(auVar113);
          uVar94 = 0;
          if (uVar86 != 0) {
            for (; (uVar86 >> uVar94 & 1) == 0; uVar94 = uVar94 + 1) {
            }
          }
          uVar88 = (ulong)uVar94;
          *(undefined4 *)(local_6c0 + uVar88 * 4) = 0;
          aVar8 = (ray->dir).field_0.field_1;
          local_860 = aVar8.x;
          fStack_85c = aVar8.y;
          fStack_858 = aVar8.z;
          aStack_854 = aVar8.field_3;
          auVar193 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
          fVar247 = local_1c0[uVar88];
          uVar94 = *(uint *)(local_5c0 + uVar88 * 4);
          if (auVar193._0_4_ < 0.0) {
            auVar338 = ZEXT1664(auVar338._0_16_);
            auVar348 = ZEXT1664(auVar348._0_16_);
            auVar359 = ZEXT1664(auVar359._0_16_);
            auVar378 = ZEXT1664(auVar378._0_16_);
            fVar255 = sqrtf(auVar193._0_4_);
            uVar88 = extraout_RAX_03;
          }
          else {
            auVar193 = vsqrtss_avx(auVar193,auVar193);
            fVar255 = auVar193._0_4_;
          }
          auVar279 = ZEXT464(uVar94);
          auVar20 = vminps_avx(auVar17,_local_9a0);
          auVar193 = vmaxps_avx(auVar17,_local_9a0);
          auVar21 = vminps_avx(auVar22,_local_9b0);
          auVar102 = vminps_avx(auVar20,auVar21);
          auVar20 = vmaxps_avx(auVar22,_local_9b0);
          auVar21 = vmaxps_avx(auVar193,auVar20);
          auVar196._8_4_ = 0x7fffffff;
          auVar196._0_8_ = 0x7fffffff7fffffff;
          auVar196._12_4_ = 0x7fffffff;
          auVar193 = vandps_avx(auVar102,auVar196);
          auVar20 = vandps_avx(auVar21,auVar196);
          auVar193 = vmaxps_avx(auVar193,auVar20);
          auVar20 = vmovshdup_avx(auVar193);
          auVar20 = vmaxss_avx(auVar20,auVar193);
          auVar193 = vshufpd_avx(auVar193,auVar193,1);
          auVar193 = vmaxss_avx(auVar193,auVar20);
          local_880 = auVar193._0_4_ * 1.9073486e-06;
          local_8c0._0_4_ = fVar255 * 1.9073486e-06;
          local_780._0_16_ = vshufps_avx(auVar21,auVar21,0xff);
          auVar193 = vinsertps_avx(ZEXT416(uVar94),ZEXT416((uint)fVar247),0x10);
          uVar90 = 0;
          while( true ) {
            bVar85 = (byte)uVar88;
            if (uVar90 == 5) break;
            auVar21 = vmovshdup_avx(auVar193);
            fVar185 = auVar21._0_4_;
            fVar184 = 1.0 - fVar185;
            fVar247 = fVar184 * fVar184;
            fVar255 = fVar184 * fVar247;
            fVar257 = fVar185 * fVar185;
            fVar261 = fVar185 * fVar257;
            fVar183 = fVar185 * fVar184;
            auVar20 = vshufps_avx(ZEXT416((uint)(fVar261 * 0.16666667)),
                                  ZEXT416((uint)(fVar261 * 0.16666667)),0);
            auVar102 = ZEXT416((uint)((fVar261 * 4.0 + fVar255 +
                                      fVar185 * fVar183 * 12.0 + fVar184 * fVar183 * 6.0) *
                                     0.16666667));
            auVar102 = vshufps_avx(auVar102,auVar102,0);
            auVar109 = ZEXT416((uint)((fVar255 * 4.0 + fVar261 +
                                      fVar184 * fVar183 * 12.0 + fVar185 * fVar183 * 6.0) *
                                     0.16666667));
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            auVar101 = vshufps_avx(auVar193,auVar193,0);
            auVar168._0_4_ = auVar101._0_4_ * local_860 + 0.0;
            auVar168._4_4_ = auVar101._4_4_ * fStack_85c + 0.0;
            auVar168._8_4_ = auVar101._8_4_ * fStack_858 + 0.0;
            auVar168._12_4_ = auVar101._12_4_ * aStack_854.w + 0.0;
            auVar101 = vshufps_avx(ZEXT416((uint)(fVar255 * 0.16666667)),
                                   ZEXT416((uint)(fVar255 * 0.16666667)),0);
            auVar107._0_4_ =
                 auVar101._0_4_ * local_ab0 +
                 auVar109._0_4_ * (float)local_9a0._0_4_ +
                 auVar20._0_4_ * (float)local_9b0._0_4_ + auVar102._0_4_ * local_ac0;
            auVar107._4_4_ =
                 auVar101._4_4_ * fStack_aac +
                 auVar109._4_4_ * (float)local_9a0._4_4_ +
                 auVar20._4_4_ * (float)local_9b0._4_4_ + auVar102._4_4_ * fStack_abc;
            auVar107._8_4_ =
                 auVar101._8_4_ * fStack_aa8 +
                 auVar109._8_4_ * fStack_998 +
                 auVar20._8_4_ * fStack_9a8 + auVar102._8_4_ * fStack_ab8;
            auVar107._12_4_ =
                 auVar101._12_4_ * fStack_aa4 +
                 auVar109._12_4_ * fStack_994 +
                 auVar20._12_4_ * fStack_9a4 + auVar102._12_4_ * fStack_ab4;
            local_8a0._0_16_ = auVar107;
            auVar20 = vsubps_avx(auVar168,auVar107);
            _local_a40 = auVar20;
            auVar20 = vdpps_avx(auVar20,auVar20,0x7f);
            fVar255 = auVar20._0_4_;
            if (fVar255 < 0.0) {
              local_9e0._0_16_ = auVar21;
              local_940._0_4_ = fVar257;
              local_a00._0_4_ = fVar247;
              local_a20._0_4_ = fVar183;
              fVar261 = sqrtf(fVar255);
              uVar88 = extraout_RAX_04;
              fVar247 = (float)local_a00._0_4_;
              auVar21 = local_9e0._0_16_;
              fVar257 = (float)local_940._0_4_;
            }
            else {
              auVar102 = vsqrtss_avx(auVar20,auVar20);
              fVar261 = auVar102._0_4_;
              local_a20._0_4_ = fVar183;
            }
            auVar378 = ZEXT464((uint)fVar257);
            auVar359 = ZEXT1664(auVar21);
            fVar183 = auVar21._0_4_;
            auVar102 = vshufps_avx(ZEXT416((uint)(fVar257 * 0.5)),ZEXT416((uint)(fVar257 * 0.5)),0);
            auVar109 = ZEXT416((uint)((fVar247 + (float)local_a20._0_4_ * 4.0) * 0.5));
            auVar109 = vshufps_avx(auVar109,auVar109,0);
            auVar101 = ZEXT416((uint)((fVar183 * -fVar183 - (float)local_a20._0_4_ * 4.0) * 0.5));
            auVar101 = vshufps_avx(auVar101,auVar101,0);
            auVar108 = ZEXT416((uint)(fVar184 * -fVar184 * 0.5));
            auVar108 = vshufps_avx(auVar108,auVar108,0);
            auVar295._0_4_ =
                 local_ab0 * auVar108._0_4_ +
                 (float)local_9a0._0_4_ * auVar101._0_4_ +
                 (float)local_9b0._0_4_ * auVar102._0_4_ + local_ac0 * auVar109._0_4_;
            auVar295._4_4_ =
                 fStack_aac * auVar108._4_4_ +
                 (float)local_9a0._4_4_ * auVar101._4_4_ +
                 (float)local_9b0._4_4_ * auVar102._4_4_ + fStack_abc * auVar109._4_4_;
            auVar295._8_4_ =
                 fStack_aa8 * auVar108._8_4_ +
                 fStack_998 * auVar101._8_4_ +
                 fStack_9a8 * auVar102._8_4_ + fStack_ab8 * auVar109._8_4_;
            auVar295._12_4_ =
                 fStack_aa4 * auVar108._12_4_ +
                 fStack_994 * auVar101._12_4_ +
                 fStack_9a4 * auVar102._12_4_ + fStack_ab4 * auVar109._12_4_;
            auVar102 = vshufps_avx(auVar193,auVar193,0x55);
            auVar109 = ZEXT416((uint)(fVar184 - (fVar183 + fVar183)));
            auVar101 = vshufps_avx(auVar109,auVar109,0);
            auVar109 = ZEXT416((uint)(fVar183 - (fVar184 + fVar184)));
            auVar108 = vshufps_avx(auVar109,auVar109,0);
            auVar142 = vshufps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),0);
            auVar109 = vdpps_avx(auVar295,auVar295,0x7f);
            auVar140._0_4_ =
                 local_ab0 * auVar142._0_4_ +
                 (float)local_9a0._0_4_ * auVar108._0_4_ +
                 (float)local_9b0._0_4_ * auVar102._0_4_ + local_ac0 * auVar101._0_4_;
            auVar140._4_4_ =
                 fStack_aac * auVar142._4_4_ +
                 (float)local_9a0._4_4_ * auVar108._4_4_ +
                 (float)local_9b0._4_4_ * auVar102._4_4_ + fStack_abc * auVar101._4_4_;
            auVar140._8_4_ =
                 fStack_aa8 * auVar142._8_4_ +
                 fStack_998 * auVar108._8_4_ +
                 fStack_9a8 * auVar102._8_4_ + fStack_ab8 * auVar101._8_4_;
            auVar140._12_4_ =
                 fStack_aa4 * auVar142._12_4_ +
                 fStack_994 * auVar108._12_4_ +
                 fStack_9a4 * auVar102._12_4_ + fStack_ab4 * auVar101._12_4_;
            auVar102 = vblendps_avx(auVar109,_DAT_01f45a50,0xe);
            auVar101 = vrsqrtss_avx(auVar102,auVar102);
            fVar183 = auVar101._0_4_;
            fVar247 = auVar109._0_4_;
            auVar101 = vdpps_avx(auVar295,auVar140,0x7f);
            auVar108 = vshufps_avx(auVar109,auVar109,0);
            auVar141._0_4_ = auVar140._0_4_ * auVar108._0_4_;
            auVar141._4_4_ = auVar140._4_4_ * auVar108._4_4_;
            auVar141._8_4_ = auVar140._8_4_ * auVar108._8_4_;
            auVar141._12_4_ = auVar140._12_4_ * auVar108._12_4_;
            auVar101 = vshufps_avx(auVar101,auVar101,0);
            auVar214._0_4_ = auVar295._0_4_ * auVar101._0_4_;
            auVar214._4_4_ = auVar295._4_4_ * auVar101._4_4_;
            auVar214._8_4_ = auVar295._8_4_ * auVar101._8_4_;
            auVar214._12_4_ = auVar295._12_4_ * auVar101._12_4_;
            auVar142 = vsubps_avx(auVar141,auVar214);
            auVar101 = vrcpss_avx(auVar102,auVar102);
            auVar102 = vmaxss_avx(ZEXT416((uint)local_880),
                                  ZEXT416((uint)(auVar193._0_4_ * (float)local_8c0._0_4_)));
            auVar101 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - fVar247 * auVar101._0_4_)));
            auVar101 = vshufps_avx(auVar101,auVar101,0);
            uVar76 = CONCAT44(auVar295._4_4_,auVar295._0_4_);
            auVar343._0_8_ = uVar76 ^ 0x8000000080000000;
            auVar343._8_4_ = -auVar295._8_4_;
            auVar343._12_4_ = -auVar295._12_4_;
            auVar108 = ZEXT416((uint)(fVar183 * 1.5 + fVar247 * -0.5 * fVar183 * fVar183 * fVar183))
            ;
            auVar108 = vshufps_avx(auVar108,auVar108,0);
            auVar197._0_4_ = auVar108._0_4_ * auVar142._0_4_ * auVar101._0_4_;
            auVar197._4_4_ = auVar108._4_4_ * auVar142._4_4_ * auVar101._4_4_;
            auVar197._8_4_ = auVar108._8_4_ * auVar142._8_4_ * auVar101._8_4_;
            auVar197._12_4_ = auVar108._12_4_ * auVar142._12_4_ * auVar101._12_4_;
            local_a20._0_4_ = auVar295._0_4_ * auVar108._0_4_;
            local_a20._4_4_ = auVar295._4_4_ * auVar108._4_4_;
            local_a20._8_4_ = auVar295._8_4_ * auVar108._8_4_;
            local_a20._12_4_ = auVar295._12_4_ * auVar108._12_4_;
            local_9e0._0_4_ = auVar102._0_4_;
            if (fVar247 < 0.0) {
              local_940._0_4_ = fVar261;
              local_a00._0_16_ = auVar343;
              local_8e0._0_16_ = auVar197;
              auVar359 = ZEXT1664(auVar21);
              auVar378 = ZEXT464((uint)fVar257);
              fVar257 = sqrtf(fVar247);
              uVar88 = extraout_RAX_05;
              auVar197 = local_8e0._0_16_;
              auVar343 = local_a00._0_16_;
              fVar247 = (float)local_9e0._0_4_;
            }
            else {
              auVar21 = vsqrtss_avx(auVar109,auVar109);
              fVar257 = auVar21._0_4_;
              local_940._0_4_ = fVar261;
              fVar247 = auVar102._0_4_;
            }
            auVar348 = ZEXT1664(auVar343);
            auVar21 = vdpps_avx(_local_a40,local_a20._0_16_,0x7f);
            local_a00._0_4_ =
                 (local_880 / fVar257) * ((float)local_940._0_4_ + 1.0) +
                 fVar247 + (float)local_940._0_4_ * local_880;
            auVar102 = vdpps_avx(auVar343,local_a20._0_16_,0x7f);
            auVar109 = vdpps_avx(_local_a40,auVar197,0x7f);
            auVar80._4_4_ = fStack_85c;
            auVar80._0_4_ = local_860;
            auVar80._8_4_ = fStack_858;
            auVar80._12_4_ = aStack_854.a;
            auVar101 = vdpps_avx(auVar80,local_a20._0_16_,0x7f);
            auVar108 = vdpps_avx(_local_a40,auVar343,0x7f);
            fVar257 = auVar102._0_4_ + auVar109._0_4_;
            fVar261 = auVar21._0_4_;
            auVar110._0_4_ = fVar261 * fVar261;
            auVar110._4_4_ = auVar21._4_4_ * auVar21._4_4_;
            auVar110._8_4_ = auVar21._8_4_ * auVar21._8_4_;
            auVar110._12_4_ = auVar21._12_4_ * auVar21._12_4_;
            auVar109 = vsubps_avx(auVar20,auVar110);
            local_a20._0_16_ = ZEXT416((uint)fVar257);
            auVar102 = vdpps_avx(_local_a40,auVar80,0x7f);
            fVar183 = auVar108._0_4_ - fVar261 * fVar257;
            local_940._0_16_ = auVar21;
            fVar261 = auVar102._0_4_ - fVar261 * auVar101._0_4_;
            auVar21 = vrsqrtss_avx(auVar109,auVar109);
            fVar184 = auVar109._0_4_;
            fVar257 = auVar21._0_4_;
            fVar257 = fVar257 * 1.5 + fVar184 * -0.5 * fVar257 * fVar257 * fVar257;
            if (fVar184 < 0.0) {
              local_8e0._0_16_ = auVar101;
              local_720._0_4_ = fVar183;
              local_740._0_4_ = fVar261;
              local_760._0_4_ = fVar257;
              auVar348 = ZEXT1664(auVar343);
              auVar359 = ZEXT1664(auVar359._0_16_);
              auVar378 = ZEXT1664(auVar378._0_16_);
              fVar184 = sqrtf(fVar184);
              uVar88 = extraout_RAX_06;
              fVar257 = (float)local_760._0_4_;
              fVar183 = (float)local_720._0_4_;
              fVar261 = (float)local_740._0_4_;
              auVar101 = local_8e0._0_16_;
              fVar247 = (float)local_9e0._0_4_;
            }
            else {
              auVar21 = vsqrtss_avx(auVar109,auVar109);
              fVar184 = auVar21._0_4_;
            }
            auVar279 = ZEXT1664(auVar20);
            auVar142 = vpermilps_avx(local_8a0._0_16_,0xff);
            auVar108 = vshufps_avx(auVar295,auVar295,0xff);
            fVar183 = fVar183 * fVar257 - auVar108._0_4_;
            auVar215._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
            auVar215._8_4_ = auVar101._8_4_ ^ 0x80000000;
            auVar215._12_4_ = auVar101._12_4_ ^ 0x80000000;
            auVar229._0_4_ = -fVar183;
            auVar229._4_4_ = 0x80000000;
            auVar229._8_4_ = 0x80000000;
            auVar229._12_4_ = 0x80000000;
            auVar338 = ZEXT1664(local_a20._0_16_);
            auVar21 = vinsertps_avx(auVar229,ZEXT416((uint)(fVar261 * fVar257)),0x1c);
            auVar109 = vmovsldup_avx(ZEXT416((uint)(local_a20._0_4_ * fVar261 * fVar257 -
                                                   auVar101._0_4_ * fVar183)));
            auVar21 = vdivps_avx(auVar21,auVar109);
            auVar102 = vinsertps_avx(local_a20._0_16_,auVar215,0x10);
            auVar102 = vdivps_avx(auVar102,auVar109);
            auVar109 = vmovsldup_avx(local_940._0_16_);
            auVar142 = ZEXT416((uint)(fVar184 - auVar142._0_4_));
            auVar101 = vmovsldup_avx(auVar142);
            auVar169._0_4_ = auVar109._0_4_ * auVar21._0_4_ + auVar101._0_4_ * auVar102._0_4_;
            auVar169._4_4_ = auVar109._4_4_ * auVar21._4_4_ + auVar101._4_4_ * auVar102._4_4_;
            auVar169._8_4_ = auVar109._8_4_ * auVar21._8_4_ + auVar101._8_4_ * auVar102._8_4_;
            auVar169._12_4_ = auVar109._12_4_ * auVar21._12_4_ + auVar101._12_4_ * auVar102._12_4_;
            auVar193 = vsubps_avx(auVar193,auVar169);
            auVar170._8_4_ = 0x7fffffff;
            auVar170._0_8_ = 0x7fffffff7fffffff;
            auVar170._12_4_ = 0x7fffffff;
            auVar21 = vandps_avx(local_940._0_16_,auVar170);
            if (auVar21._0_4_ < (float)local_a00._0_4_) {
              auVar198._8_4_ = 0x7fffffff;
              auVar198._0_8_ = 0x7fffffff7fffffff;
              auVar198._12_4_ = 0x7fffffff;
              auVar21 = vandps_avx(auVar142,auVar198);
              if (auVar21._0_4_ <
                  (float)local_780._0_4_ * 1.9073486e-06 + fVar247 + (float)local_a00._0_4_) {
                bVar96 = uVar90 < 5;
                fVar247 = auVar193._0_4_ + (float)local_840._0_4_;
                bVar85 = 0;
                if (((ray->org).field_0.m128[3] <= fVar247) &&
                   (fVar257 = ray->tfar, fVar247 <= fVar257)) {
                  auVar193 = vmovshdup_avx(auVar193);
                  fVar261 = auVar193._0_4_;
                  bVar85 = 0;
                  if ((0.0 <= fVar261) && (bVar85 = 0, fVar261 <= 1.0)) {
                    auVar193 = vrsqrtss_avx(auVar20,auVar20);
                    fVar183 = auVar193._0_4_;
                    pGVar12 = (context->scene->geometries).items[uVar91].ptr;
                    if ((pGVar12->mask & ray->mask) == 0) {
                      bVar85 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar85 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar193 = ZEXT416((uint)(fVar183 * 1.5 +
                                               fVar255 * -0.5 * fVar183 * fVar183 * fVar183));
                      auVar193 = vshufps_avx(auVar193,auVar193,0);
                      auVar199._0_4_ = auVar193._0_4_ * (float)local_a40._0_4_;
                      auVar199._4_4_ = auVar193._4_4_ * (float)local_a40._4_4_;
                      auVar199._8_4_ = auVar193._8_4_ * fStack_a38;
                      auVar199._12_4_ = auVar193._12_4_ * fStack_a34;
                      auVar111._0_4_ = auVar295._0_4_ + auVar108._0_4_ * auVar199._0_4_;
                      auVar111._4_4_ = auVar295._4_4_ + auVar108._4_4_ * auVar199._4_4_;
                      auVar111._8_4_ = auVar295._8_4_ + auVar108._8_4_ * auVar199._8_4_;
                      auVar111._12_4_ = auVar295._12_4_ + auVar108._12_4_ * auVar199._12_4_;
                      auVar193 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar21 = vshufps_avx(auVar295,auVar295,0xc9);
                      auVar200._0_4_ = auVar21._0_4_ * auVar199._0_4_;
                      auVar200._4_4_ = auVar21._4_4_ * auVar199._4_4_;
                      auVar200._8_4_ = auVar21._8_4_ * auVar199._8_4_;
                      auVar200._12_4_ = auVar21._12_4_ * auVar199._12_4_;
                      auVar216._0_4_ = auVar295._0_4_ * auVar193._0_4_;
                      auVar216._4_4_ = auVar295._4_4_ * auVar193._4_4_;
                      auVar216._8_4_ = auVar295._8_4_ * auVar193._8_4_;
                      auVar216._12_4_ = auVar295._12_4_ * auVar193._12_4_;
                      auVar102 = vsubps_avx(auVar216,auVar200);
                      auVar193 = vshufps_avx(auVar102,auVar102,0xc9);
                      auVar21 = vshufps_avx(auVar111,auVar111,0xc9);
                      auVar217._0_4_ = auVar21._0_4_ * auVar193._0_4_;
                      auVar217._4_4_ = auVar21._4_4_ * auVar193._4_4_;
                      auVar217._8_4_ = auVar21._8_4_ * auVar193._8_4_;
                      auVar217._12_4_ = auVar21._12_4_ * auVar193._12_4_;
                      auVar193 = vshufps_avx(auVar102,auVar102,0xd2);
                      auVar112._0_4_ = auVar111._0_4_ * auVar193._0_4_;
                      auVar112._4_4_ = auVar111._4_4_ * auVar193._4_4_;
                      auVar112._8_4_ = auVar111._8_4_ * auVar193._8_4_;
                      auVar112._12_4_ = auVar111._12_4_ * auVar193._12_4_;
                      auVar21 = vsubps_avx(auVar217,auVar112);
                      auVar193 = vshufps_avx(auVar21,auVar21,0xe9);
                      local_920 = vmovlps_avx(auVar193);
                      local_918 = auVar21._0_4_;
                      local_910 = 0;
                      local_90c = (undefined4)local_8e8;
                      local_904 = context->user->instID[0];
                      local_900 = context->user->instPrimID[0];
                      ray->tfar = fVar247;
                      local_a44 = -1;
                      local_990.valid = &local_a44;
                      local_990.geometryUserPtr = pGVar12->userPtr;
                      local_990.context = context->user;
                      local_990.hit = (RTCHitN *)&local_920;
                      local_990.N = 1;
                      local_990.ray = (RTCRayN *)ray;
                      local_914 = fVar261;
                      local_908 = uVar91;
                      if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_008c6eb4:
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          auVar338 = ZEXT1664(auVar338._0_16_);
                          auVar348 = ZEXT1664(auVar348._0_16_);
                          auVar359 = ZEXT1664(auVar359._0_16_);
                          auVar378 = ZEXT1664(auVar378._0_16_);
                          (*p_Var16)(&local_990);
                          if (*local_990.valid == 0) goto LAB_008c6efc;
                        }
                        bVar85 = 1;
                      }
                      else {
                        auVar279 = ZEXT1664(auVar20);
                        auVar338 = ZEXT1664(local_a20._0_16_);
                        auVar348 = ZEXT1664(auVar348._0_16_);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        auVar378 = ZEXT1664(auVar378._0_16_);
                        (*pGVar12->occlusionFilterN)(&local_990);
                        if (*local_990.valid != 0) goto LAB_008c6eb4;
LAB_008c6efc:
                        ray->tfar = fVar257;
                        bVar85 = 0;
                      }
                    }
                  }
                }
                goto LAB_008c6cb7;
              }
            }
            uVar90 = uVar90 + 1;
          }
          bVar96 = false;
LAB_008c6cb7:
          bVar95 = bVar95 | bVar96 & bVar85;
          fVar247 = ray->tfar;
          auVar152._4_4_ = fVar247;
          auVar152._0_4_ = fVar247;
          auVar152._8_4_ = fVar247;
          auVar152._12_4_ = fVar247;
          auVar152._16_4_ = fVar247;
          auVar152._20_4_ = fVar247;
          auVar152._24_4_ = fVar247;
          auVar152._28_4_ = fVar247;
          auVar106._0_4_ = ray->tfar;
          auVar106._4_4_ = ray->mask;
          auVar106._8_4_ = ray->id;
          auVar106._12_4_ = ray->flags;
          auVar113 = vcmpps_avx(_local_960,auVar152,2);
        }
        auVar113 = vandps_avx(local_640,local_700);
        auVar201 = vandps_avx(_local_800,local_7e0);
        auVar254 = ZEXT3264(_local_6e0);
        auVar221._0_4_ = local_6e0._0_4_ + local_5a0._0_4_;
        auVar221._4_4_ = local_6e0._4_4_ + local_5a0._4_4_;
        auVar221._8_4_ = local_6e0._8_4_ + local_5a0._8_4_;
        auVar221._12_4_ = local_6e0._12_4_ + local_5a0._12_4_;
        auVar221._16_4_ = local_6e0._16_4_ + local_5a0._16_4_;
        auVar221._20_4_ = local_6e0._20_4_ + local_5a0._20_4_;
        auVar221._24_4_ = local_6e0._24_4_ + local_5a0._24_4_;
        auVar221._28_4_ = local_6e0._28_4_ + local_5a0._28_4_;
        auVar193 = vshufps_avx(auVar106,auVar106,0);
        auVar238._16_16_ = auVar193;
        auVar238._0_16_ = auVar193;
        auVar27 = vcmpps_avx(auVar221,auVar238,2);
        auVar113 = vandps_avx(auVar27,auVar113);
        auVar222._0_4_ = local_6e0._0_4_ + local_5e0._0_4_;
        auVar222._4_4_ = local_6e0._4_4_ + local_5e0._4_4_;
        auVar222._8_4_ = local_6e0._8_4_ + local_5e0._8_4_;
        auVar222._12_4_ = local_6e0._12_4_ + local_5e0._12_4_;
        auVar222._16_4_ = local_6e0._16_4_ + local_5e0._16_4_;
        auVar222._20_4_ = local_6e0._20_4_ + local_5e0._20_4_;
        auVar222._24_4_ = local_6e0._24_4_ + local_5e0._24_4_;
        auVar222._28_4_ = local_6e0._28_4_ + local_5e0._28_4_;
        auVar27 = vcmpps_avx(auVar222,auVar238,2);
        auVar201 = vandps_avx(auVar27,auVar201);
        auVar201 = vorps_avx(auVar113,auVar201);
        if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar201 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar201 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar201 >> 0x7f,0) != '\0') ||
              (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar201 >> 0xbf,0) != '\0') ||
            (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar201[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar87 * 0x60) = auVar201;
          auVar113 = vblendvps_avx(_local_5e0,local_5a0,auVar113);
          *(undefined1 (*) [32])(auStack_160 + uVar87 * 0x60) = auVar113;
          uVar88 = vmovlps_avx(local_5f0);
          (&uStack_140)[uVar87 * 0xc] = uVar88;
          auStack_138[uVar87 * 0x18] = local_b24 + 1;
          uVar87 = (ulong)((int)uVar87 + 1);
        }
      }
    }
    auVar10._0_4_ = ray->tfar;
    auVar10._4_4_ = ray->mask;
    auVar10._8_4_ = ray->id;
    auVar10._12_4_ = ray->flags;
    fVar247 = ray->tfar;
    auVar172._4_4_ = fVar247;
    auVar172._0_4_ = fVar247;
    auVar172._8_4_ = fVar247;
    auVar172._12_4_ = fVar247;
    auVar172._16_4_ = fVar247;
    auVar172._20_4_ = fVar247;
    auVar172._24_4_ = fVar247;
    auVar172._28_4_ = fVar247;
    while( true ) {
      uVar94 = (uint)uVar87;
      if (uVar94 == 0) {
        if (bVar95 != 0) goto LAB_008c7109;
        auVar19 = vshufps_avx(auVar10,auVar10,0);
        auVar19 = vcmpps_avx(local_600,auVar19,2);
        uVar91 = vmovmskps_avx(auVar19);
        uVar91 = (uint)local_828 - 1 & (uint)local_828 & uVar91;
        goto LAB_008c4832;
      }
      uVar87 = (ulong)(uVar94 - 1);
      lVar92 = uVar87 * 0x60;
      auVar113 = *(undefined1 (*) [32])(auStack_160 + lVar92);
      auVar146._0_4_ = auVar113._0_4_ + (float)local_6e0._0_4_;
      auVar146._4_4_ = auVar113._4_4_ + (float)local_6e0._4_4_;
      auVar146._8_4_ = auVar113._8_4_ + fStack_6d8;
      auVar146._12_4_ = auVar113._12_4_ + fStack_6d4;
      auVar146._16_4_ = auVar113._16_4_ + fStack_6d0;
      auVar146._20_4_ = auVar113._20_4_ + fStack_6cc;
      auVar146._24_4_ = auVar113._24_4_ + fStack_6c8;
      auVar146._28_4_ = auVar113._28_4_ + fStack_6c4;
      auVar27 = vcmpps_avx(auVar146,auVar172,2);
      auVar240 = ZEXT3264(auVar27);
      auVar201 = vandps_avx(auVar27,*(undefined1 (*) [32])(auStack_180 + lVar92));
      local_5a0 = auVar201;
      auVar27 = *(undefined1 (*) [32])(auStack_180 + lVar92) & auVar27;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') break;
      uVar87 = (ulong)(uVar94 - 1);
    }
    auVar117._8_4_ = 0x7f800000;
    auVar117._0_8_ = 0x7f8000007f800000;
    auVar117._12_4_ = 0x7f800000;
    auVar117._16_4_ = 0x7f800000;
    auVar117._20_4_ = 0x7f800000;
    auVar117._24_4_ = 0x7f800000;
    auVar117._28_4_ = 0x7f800000;
    auVar113 = vblendvps_avx(auVar117,auVar113,auVar201);
    auVar27 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar27 = vminps_avx(auVar113,auVar27);
    auVar24 = vshufpd_avx(auVar27,auVar27,5);
    auVar27 = vminps_avx(auVar27,auVar24);
    auVar24 = vperm2f128_avx(auVar27,auVar27,1);
    auVar27 = vminps_avx(auVar27,auVar24);
    auVar113 = vcmpps_avx(auVar113,auVar27,0);
    auVar27 = auVar201 & auVar113;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0x7f,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0xbf,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0')
    {
      auVar201 = vandps_avx(auVar113,auVar201);
    }
    auVar99._8_8_ = 0;
    auVar99._0_8_ = (&uStack_140)[uVar87 * 0xc];
    local_b24 = auStack_138[uVar87 * 0x18];
    uVar89 = vmovmskps_avx(auVar201);
    uVar86 = 0;
    if (uVar89 != 0) {
      for (; (uVar89 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
      }
    }
    *(undefined4 *)(local_5a0 + (ulong)uVar86 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar92) = local_5a0;
    uVar89 = uVar94 - 1;
    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5a0 >> 0x7f,0) != '\0') ||
          (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5a0 >> 0xbf,0) != '\0') ||
        (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5a0[0x1f] < '\0') {
      uVar89 = uVar94;
    }
    auVar193 = vshufps_avx(auVar99,auVar99,0);
    auVar20 = vshufps_avx(auVar99,auVar99,0x55);
    auVar20 = vsubps_avx(auVar20,auVar193);
    local_5e0._4_4_ = auVar193._4_4_ + auVar20._4_4_ * 0.14285715;
    local_5e0._0_4_ = auVar193._0_4_ + auVar20._0_4_ * 0.0;
    fStack_5d8 = auVar193._8_4_ + auVar20._8_4_ * 0.2857143;
    fStack_5d4 = auVar193._12_4_ + auVar20._12_4_ * 0.42857146;
    fStack_5d0 = auVar193._0_4_ + auVar20._0_4_ * 0.5714286;
    fStack_5cc = auVar193._4_4_ + auVar20._4_4_ * 0.71428573;
    fStack_5c8 = auVar193._8_4_ + auVar20._8_4_ * 0.8571429;
    fStack_5c4 = auVar193._12_4_ + auVar20._12_4_;
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_5e0 + (ulong)uVar86 * 4);
    uVar87 = (ulong)uVar89;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }